

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  BYTE *pBVar7;
  ulong *iLimit;
  char *pcVar8;
  char *pcVar9;
  BYTE *pBVar10;
  uint uVar11;
  U32 *pUVar12;
  U16 *pUVar13;
  ushort uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  U32 target;
  seqDef *psVar18;
  byte bVar19;
  byte bVar20;
  ulong *puVar21;
  ulong *puVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong *puVar27;
  BYTE *pBVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  U32 UVar32;
  uint uVar33;
  long lVar34;
  U32 UVar35;
  U32 *hashTable;
  ulong uVar36;
  ulong uVar37;
  U32 target_5;
  uint uVar38;
  BYTE *pBVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  BYTE *base;
  ulong *puVar43;
  ulong *puVar44;
  U32 lowestValid;
  uint uVar45;
  long lVar46;
  BYTE *litEnd;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  BYTE *pStart;
  BYTE *pStart_6;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  BYTE *local_178;
  ulong local_140;
  uint local_128;
  ulong *local_110;
  ulong *local_f8;
  uint auStack_b8 [34];
  char cVar54;
  undefined1 uVar72;
  char cVar73;
  undefined1 uVar74;
  char cVar75;
  undefined1 uVar76;
  char cVar77;
  
  pBVar28 = (ms->window).base;
  uVar11 = (ms->window).dictLimit;
  pBVar39 = pBVar28 + uVar11;
  puVar43 = (ulong *)((ulong)((int)src == (int)pBVar39) + (long)src);
  iVar29 = (int)puVar43 - (int)pBVar28;
  uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar30 = iVar29 - uVar38;
  if (iVar29 - uVar11 <= uVar38) {
    uVar30 = uVar11;
  }
  uVar38 = rep[1];
  if (ms->loadedDictEnd != 0) {
    uVar30 = uVar11;
  }
  uVar30 = iVar29 - uVar30;
  local_128 = uVar38;
  if (uVar30 < uVar38) {
    local_128 = 0;
  }
  uVar11 = *rep;
  uVar24 = uVar11;
  if (uVar30 < uVar11) {
    uVar24 = 0;
  }
  uVar37 = (ulong)uVar24;
  uVar45 = (ms->cParams).minMatch;
  UVar32 = 6;
  if (uVar45 < 6) {
    UVar32 = uVar45;
  }
  puVar5 = (ulong *)((long)src + srcSize);
  iLimit = (ulong *)((long)src + (srcSize - 0x10));
  ZSTD_row_fillHashCache
            (ms,pBVar28,5 - ((ms->cParams).searchLog < 5),UVar32,ms->nextToUpdate,(BYTE *)iLimit);
  if (puVar43 < iLimit) {
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar3 = (ulong *)((long)puVar5 - 1);
    puVar4 = puVar5 + -4;
    do {
      uVar24 = (uint)uVar37;
      lVar46 = -uVar37;
      if (uVar24 == 0) {
        uVar25 = 0;
      }
      else {
        uVar25 = 0;
        if (*(int *)((long)((long)puVar43 + 1U) - uVar37) == *(int *)((long)puVar43 + 1)) {
          puVar44 = (ulong *)((long)puVar43 + 5);
          puVar21 = (ulong *)((long)puVar43 + lVar46 + 5);
          puVar22 = puVar44;
          if (puVar44 < puVar1) {
            if (*puVar21 == *puVar44) {
              lVar26 = 0;
              do {
                puVar22 = (ulong *)((long)puVar43 + lVar26 + 0xd);
                if (puVar1 <= puVar22) {
                  puVar21 = (ulong *)((long)puVar43 + lVar46 + lVar26 + 0xd);
                  puVar22 = (ulong *)((long)puVar43 + lVar26 + 0xd);
                  goto LAB_006b0716;
                }
                uVar25 = *(ulong *)((long)puVar43 + lVar26 + lVar46 + 0xd);
                uVar36 = *puVar22;
                lVar26 = lVar26 + 8;
              } while (uVar25 == uVar36);
              uVar36 = uVar36 ^ uVar25;
              uVar25 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar26;
            }
            else {
              uVar36 = *puVar44 ^ *puVar21;
              uVar25 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_006b0716:
            if ((puVar22 < puVar2) && ((int)*puVar21 == (int)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar22 < puVar3) && ((short)*puVar21 == (short)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar22 < puVar5) {
              puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar22));
            }
            uVar25 = (long)puVar22 - (long)puVar44;
          }
          uVar25 = uVar25 + 4;
        }
      }
      uVar45 = (ms->cParams).searchLog;
      uVar23 = (ms->cParams).minMatch;
      if (uVar45 < 5) {
        bVar19 = (byte)uVar45;
        if (uVar23 - 6 < 2) {
          pBVar28 = (ms->window).base;
          uVar36 = (long)puVar43 - (long)pBVar28;
          uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar32 = (ms->window).lowLimit;
          uVar45 = (uint)uVar36;
          UVar35 = uVar45 - uVar23;
          if (uVar45 - UVar32 <= uVar23) {
            UVar35 = UVar32;
          }
          pUVar12 = ms->hashTable;
          pUVar13 = ms->tagTable;
          if (ms->loadedDictEnd != 0) {
            UVar35 = UVar32;
          }
          uVar40 = (ulong)ms->nextToUpdate;
          bVar20 = 0x38 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar45) {
            do {
              uVar33 = (uint)uVar40 & 7;
              uVar23 = ms->hashCache[uVar33];
              ms->hashCache[uVar33] =
                   (U32)((ulong)(*(long *)(pBVar28 + uVar40 + 8) * -0x30e4432340650000) >>
                        (bVar20 & 0x3f));
              uVar42 = (ulong)(uVar23 >> 4 & 0xfffffff0);
              uVar33 = (byte)((char)pUVar13[uVar42] - 1) & 0xf;
              *(char *)(pUVar13 + uVar42) = (char)uVar33;
              *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar42 * 2) = (char)uVar23;
              pUVar12[uVar42 + uVar33] = (uint)uVar40;
              uVar40 = uVar40 + 1;
            } while (uVar40 < (uVar36 & 0xffffffff));
          }
          ms->nextToUpdate = uVar45;
          uVar23 = ms->hashCache[uVar45 & 7];
          ms->hashCache[uVar45 & 7] =
               (U32)((ulong)(*(long *)(pBVar28 + (uVar36 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (bVar20 & 0x3f));
          uVar36 = (ulong)(uVar23 >> 4 & 0xfffffff0);
          bVar20 = (byte)pUVar13[uVar36];
          pcVar8 = (char *)((long)pUVar13 + uVar36 * 2 + 1);
          uVar76 = (undefined1)(uVar23 >> 0x18);
          uVar74 = (undefined1)(uVar23 >> 0x10);
          uVar72 = (undefined1)(uVar23 >> 8);
          auVar56._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                    0x20);
          auVar56[3] = uVar72;
          auVar56[2] = uVar72;
          auVar56[0] = (undefined1)uVar23;
          auVar56[1] = auVar56[0];
          auVar56._8_8_ = 0;
          auVar79 = pshuflw(auVar56,auVar56,0);
          cVar54 = auVar79[0];
          auVar57[0] = -(cVar54 == *pcVar8);
          cVar73 = auVar79[1];
          auVar57[1] = -(cVar73 == pcVar8[1]);
          cVar75 = auVar79[2];
          auVar57[2] = -(cVar75 == pcVar8[2]);
          cVar77 = auVar79[3];
          auVar57[3] = -(cVar77 == pcVar8[3]);
          auVar57[4] = -(cVar54 == pcVar8[4]);
          auVar57[5] = -(cVar73 == pcVar8[5]);
          auVar57[6] = -(cVar75 == pcVar8[6]);
          auVar57[7] = -(cVar77 == pcVar8[7]);
          auVar57[8] = -(cVar54 == pcVar8[8]);
          auVar57[9] = -(cVar73 == pcVar8[9]);
          auVar57[10] = -(cVar75 == pcVar8[10]);
          auVar57[0xb] = -(cVar77 == pcVar8[0xb]);
          auVar57[0xc] = -(cVar54 == pcVar8[0xc]);
          auVar57[0xd] = -(cVar73 == pcVar8[0xd]);
          auVar57[0xe] = -(cVar75 == pcVar8[0xe]);
          auVar57[0xf] = -(cVar77 == pcVar8[0xf]);
          uVar14 = (ushort)(SUB161(auVar57 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar57[0xf] >> 7) << 0xf;
          uVar23 = (uint)uVar14;
          if ((bVar20 & 0xf) != 0) {
            uVar23 = (uint)uVar14 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar14 >> (bVar20 & 0xf));
          }
          if (uVar23 == 0) {
            lVar26 = 0;
          }
          else {
            lVar47 = 0;
            while( true ) {
              iVar29 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                }
              }
              lVar26 = lVar47;
              if (pUVar12[uVar36 + (iVar29 + (uint)bVar20 & 0xf)] < UVar35) break;
              lVar26 = lVar47 + 1;
              auStack_b8[lVar47] = pUVar12[uVar36 + (iVar29 + (uint)bVar20 & 0xf)];
              uVar23 = uVar23 & uVar23 - 1;
              if ((uVar23 == 0) ||
                 (iVar29 = (int)lVar47, lVar47 = lVar26, (int)(1L << (bVar19 & 0x3f)) + -1 == iVar29
                 )) break;
            }
          }
          uVar23 = bVar20 - 1 & 0xf;
          *(char *)(pUVar13 + uVar36) = (char)uVar23;
          *(undefined1 *)((long)(pUVar13 + uVar36) + (ulong)uVar23 + 1) = auVar56[0];
          UVar32 = ms->nextToUpdate;
          ms->nextToUpdate = UVar32 + 1;
          pUVar12[uVar36 + uVar23] = UVar32;
          if (lVar26 == 0) goto LAB_006b19c6;
          uVar36 = 999999999;
          lVar47 = 0;
          uVar40 = 3;
          do {
            uVar23 = auStack_b8[lVar47];
            puVar44 = (ulong *)(pBVar28 + uVar23);
            if (*(BYTE *)(uVar40 + (long)puVar44) == *(BYTE *)((long)puVar43 + uVar40)) {
              puVar22 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar44 == *puVar43) {
                  lVar16 = (ulong)uVar23 + 8;
                  lVar34 = 0;
                  do {
                    puVar22 = (ulong *)((long)puVar43 + lVar34 + 8);
                    if (puVar1 <= puVar22) {
                      puVar44 = (ulong *)(pBVar28 + lVar34 + lVar16);
                      goto LAB_006b13da;
                    }
                    lVar17 = lVar34 + lVar16;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                  uVar41 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar41 = *puVar43 ^ *puVar44;
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = uVar42 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_006b13da:
                if ((puVar22 < puVar2) && ((int)*puVar44 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar44 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar22 < puVar5) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar22));
                }
                uVar42 = (long)puVar22 - (long)puVar43;
              }
              if ((uVar40 < uVar42) &&
                 (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar40 = uVar42,
                 (ulong *)((long)puVar43 + uVar42) == puVar5)) break;
            }
            uVar42 = uVar40;
            lVar47 = lVar47 + 1;
            uVar40 = uVar42;
          } while (lVar47 != lVar26);
        }
        else if (uVar23 == 5) {
          pBVar28 = (ms->window).base;
          uVar36 = (long)puVar43 - (long)pBVar28;
          uVar45 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar32 = (ms->window).lowLimit;
          uVar23 = (uint)uVar36;
          UVar35 = uVar23 - uVar45;
          if (uVar23 - UVar32 <= uVar45) {
            UVar35 = UVar32;
          }
          pUVar12 = ms->hashTable;
          pUVar13 = ms->tagTable;
          if (ms->loadedDictEnd != 0) {
            UVar35 = UVar32;
          }
          uVar40 = (ulong)ms->nextToUpdate;
          bVar20 = 0x38 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar23) {
            do {
              uVar33 = (uint)uVar40 & 7;
              uVar45 = ms->hashCache[uVar33];
              ms->hashCache[uVar33] =
                   (U32)((ulong)(*(long *)(pBVar28 + uVar40 + 8) * -0x30e4432345000000) >>
                        (bVar20 & 0x3f));
              uVar42 = (ulong)(uVar45 >> 4 & 0xfffffff0);
              uVar33 = (byte)((char)pUVar13[uVar42] - 1) & 0xf;
              *(char *)(pUVar13 + uVar42) = (char)uVar33;
              *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar42 * 2) = (char)uVar45;
              pUVar12[uVar42 + uVar33] = (uint)uVar40;
              uVar40 = uVar40 + 1;
            } while (uVar40 < (uVar36 & 0xffffffff));
          }
          ms->nextToUpdate = uVar23;
          uVar45 = ms->hashCache[uVar23 & 7];
          ms->hashCache[uVar23 & 7] =
               (U32)((ulong)(*(long *)(pBVar28 + (uVar36 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (bVar20 & 0x3f));
          uVar36 = (ulong)(uVar45 >> 4 & 0xfffffff0);
          bVar20 = (byte)pUVar13[uVar36];
          pcVar8 = (char *)((long)pUVar13 + uVar36 * 2 + 1);
          uVar76 = (undefined1)(uVar45 >> 0x18);
          uVar74 = (undefined1)(uVar45 >> 0x10);
          uVar72 = (undefined1)(uVar45 >> 8);
          auVar61._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar45)) >>
                    0x20);
          auVar61[3] = uVar72;
          auVar61[2] = uVar72;
          auVar61[0] = (undefined1)uVar45;
          auVar61[1] = auVar61[0];
          auVar61._8_8_ = 0;
          auVar79 = pshuflw(auVar61,auVar61,0);
          cVar54 = auVar79[0];
          auVar59[0] = -(cVar54 == *pcVar8);
          cVar73 = auVar79[1];
          auVar59[1] = -(cVar73 == pcVar8[1]);
          cVar75 = auVar79[2];
          auVar59[2] = -(cVar75 == pcVar8[2]);
          cVar77 = auVar79[3];
          auVar59[3] = -(cVar77 == pcVar8[3]);
          auVar59[4] = -(cVar54 == pcVar8[4]);
          auVar59[5] = -(cVar73 == pcVar8[5]);
          auVar59[6] = -(cVar75 == pcVar8[6]);
          auVar59[7] = -(cVar77 == pcVar8[7]);
          auVar59[8] = -(cVar54 == pcVar8[8]);
          auVar59[9] = -(cVar73 == pcVar8[9]);
          auVar59[10] = -(cVar75 == pcVar8[10]);
          auVar59[0xb] = -(cVar77 == pcVar8[0xb]);
          auVar59[0xc] = -(cVar54 == pcVar8[0xc]);
          auVar59[0xd] = -(cVar73 == pcVar8[0xd]);
          auVar59[0xe] = -(cVar75 == pcVar8[0xe]);
          auVar59[0xf] = -(cVar77 == pcVar8[0xf]);
          uVar14 = (ushort)(SUB161(auVar59 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar59[0xf] >> 7) << 0xf;
          uVar45 = (uint)uVar14;
          if ((bVar20 & 0xf) != 0) {
            uVar45 = (uint)uVar14 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar14 >> (bVar20 & 0xf));
          }
          if (uVar45 == 0) {
            lVar26 = 0;
          }
          else {
            lVar47 = 0;
            while( true ) {
              iVar29 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                }
              }
              lVar26 = lVar47;
              if (pUVar12[uVar36 + (iVar29 + (uint)bVar20 & 0xf)] < UVar35) break;
              lVar26 = lVar47 + 1;
              auStack_b8[lVar47] = pUVar12[uVar36 + (iVar29 + (uint)bVar20 & 0xf)];
              uVar45 = uVar45 & uVar45 - 1;
              if ((uVar45 == 0) ||
                 (iVar29 = (int)lVar47, lVar47 = lVar26, (1 << (bVar19 & 0x1f)) + -1 == iVar29))
              break;
            }
          }
          uVar45 = bVar20 - 1 & 0xf;
          *(char *)(pUVar13 + uVar36) = (char)uVar45;
          *(undefined1 *)((long)(pUVar13 + uVar36) + (ulong)uVar45 + 1) = auVar61[0];
          UVar32 = ms->nextToUpdate;
          ms->nextToUpdate = UVar32 + 1;
          pUVar12[uVar36 + uVar45] = UVar32;
          if (lVar26 == 0) goto LAB_006b19c6;
          uVar36 = 999999999;
          lVar47 = 0;
          uVar40 = 3;
          do {
            uVar45 = auStack_b8[lVar47];
            puVar44 = (ulong *)(pBVar28 + uVar45);
            if (*(BYTE *)(uVar40 + (long)puVar44) == *(BYTE *)((long)puVar43 + uVar40)) {
              puVar22 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar44 == *puVar43) {
                  lVar16 = (ulong)uVar45 + 8;
                  lVar34 = 0;
                  do {
                    puVar22 = (ulong *)((long)puVar43 + lVar34 + 8);
                    if (puVar1 <= puVar22) {
                      puVar44 = (ulong *)(pBVar28 + lVar34 + lVar16);
                      goto LAB_006b16a8;
                    }
                    lVar17 = lVar34 + lVar16;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                  uVar41 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar41 = *puVar43 ^ *puVar44;
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = uVar42 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_006b16a8:
                if ((puVar22 < puVar2) && ((int)*puVar44 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar44 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar22 < puVar5) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar22));
                }
                uVar42 = (long)puVar22 - (long)puVar43;
              }
              if ((uVar40 < uVar42) &&
                 (uVar36 = (ulong)((uVar23 + 2) - uVar45), uVar40 = uVar42,
                 (ulong *)((long)puVar43 + uVar42) == puVar5)) break;
            }
            uVar42 = uVar40;
            lVar47 = lVar47 + 1;
            uVar40 = uVar42;
          } while (lVar47 != lVar26);
        }
        else {
          pBVar28 = (ms->window).base;
          uVar36 = (long)puVar43 - (long)pBVar28;
          uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar32 = (ms->window).lowLimit;
          uVar45 = (uint)uVar36;
          UVar35 = uVar45 - uVar23;
          if (uVar45 - UVar32 <= uVar23) {
            UVar35 = UVar32;
          }
          pUVar12 = ms->hashTable;
          pUVar13 = ms->tagTable;
          if (ms->loadedDictEnd != 0) {
            UVar35 = UVar32;
          }
          uVar40 = (ulong)ms->nextToUpdate;
          bVar20 = 0x18 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar45) {
            do {
              uVar33 = (uint)uVar40 & 7;
              uVar23 = ms->hashCache[uVar33];
              ms->hashCache[uVar33] =
                   (uint)(*(int *)(pBVar28 + uVar40 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
              uVar42 = (ulong)(uVar23 >> 4 & 0xfffffff0);
              uVar33 = (byte)((char)pUVar13[uVar42] - 1) & 0xf;
              *(char *)(pUVar13 + uVar42) = (char)uVar33;
              *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar42 * 2) = (char)uVar23;
              pUVar12[uVar42 + uVar33] = (uint)uVar40;
              uVar40 = uVar40 + 1;
            } while (uVar40 < (uVar36 & 0xffffffff));
          }
          ms->nextToUpdate = uVar45;
          uVar23 = ms->hashCache[uVar45 & 7];
          ms->hashCache[uVar45 & 7] =
               (uint)(*(int *)(pBVar28 + (uVar36 & 0xffffffff) + 8) * -0x61c8864f) >>
               (bVar20 & 0x1f);
          uVar36 = (ulong)(uVar23 >> 4 & 0xfffffff0);
          bVar20 = (byte)pUVar13[uVar36];
          pcVar8 = (char *)((long)pUVar13 + uVar36 * 2 + 1);
          uVar76 = (undefined1)(uVar23 >> 0x18);
          uVar74 = (undefined1)(uVar23 >> 0x10);
          uVar72 = (undefined1)(uVar23 >> 8);
          auVar79._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                    0x20);
          auVar79[3] = uVar72;
          auVar79[2] = uVar72;
          auVar79[0] = (undefined1)uVar23;
          auVar79[1] = auVar79[0];
          auVar79._8_8_ = 0;
          auVar61 = pshuflw(auVar79,auVar79,0);
          cVar54 = auVar61[0];
          auVar62[0] = -(cVar54 == *pcVar8);
          cVar73 = auVar61[1];
          auVar62[1] = -(cVar73 == pcVar8[1]);
          cVar75 = auVar61[2];
          auVar62[2] = -(cVar75 == pcVar8[2]);
          cVar77 = auVar61[3];
          auVar62[3] = -(cVar77 == pcVar8[3]);
          auVar62[4] = -(cVar54 == pcVar8[4]);
          auVar62[5] = -(cVar73 == pcVar8[5]);
          auVar62[6] = -(cVar75 == pcVar8[6]);
          auVar62[7] = -(cVar77 == pcVar8[7]);
          auVar62[8] = -(cVar54 == pcVar8[8]);
          auVar62[9] = -(cVar73 == pcVar8[9]);
          auVar62[10] = -(cVar75 == pcVar8[10]);
          auVar62[0xb] = -(cVar77 == pcVar8[0xb]);
          auVar62[0xc] = -(cVar54 == pcVar8[0xc]);
          auVar62[0xd] = -(cVar73 == pcVar8[0xd]);
          auVar62[0xe] = -(cVar75 == pcVar8[0xe]);
          auVar62[0xf] = -(cVar77 == pcVar8[0xf]);
          uVar14 = (ushort)(SUB161(auVar62 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar62[0xf] >> 7) << 0xf;
          uVar23 = (uint)uVar14;
          if ((bVar20 & 0xf) != 0) {
            uVar23 = (uint)uVar14 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar14 >> (bVar20 & 0xf));
          }
          if (uVar23 == 0) {
            lVar26 = 0;
          }
          else {
            lVar47 = 0;
            while( true ) {
              iVar29 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                }
              }
              lVar26 = lVar47;
              if (pUVar12[uVar36 + (iVar29 + (uint)bVar20 & 0xf)] < UVar35) break;
              lVar26 = lVar47 + 1;
              auStack_b8[lVar47] = pUVar12[uVar36 + (iVar29 + (uint)bVar20 & 0xf)];
              uVar23 = uVar23 & uVar23 - 1;
              if ((uVar23 == 0) ||
                 (iVar29 = (int)lVar47, lVar47 = lVar26, (int)(1L << (bVar19 & 0x3f)) + -1 == iVar29
                 )) break;
            }
          }
          uVar23 = bVar20 - 1 & 0xf;
          *(char *)(pUVar13 + uVar36) = (char)uVar23;
          *(undefined1 *)((long)(pUVar13 + uVar36) + (ulong)uVar23 + 1) = auVar79[0];
          UVar32 = ms->nextToUpdate;
          ms->nextToUpdate = UVar32 + 1;
          pUVar12[uVar36 + uVar23] = UVar32;
          if (lVar26 == 0) goto LAB_006b19c6;
          uVar36 = 999999999;
          lVar47 = 0;
          uVar40 = 3;
          do {
            uVar23 = auStack_b8[lVar47];
            puVar44 = (ulong *)(pBVar28 + uVar23);
            if (*(BYTE *)(uVar40 + (long)puVar44) == *(BYTE *)((long)puVar43 + uVar40)) {
              puVar22 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar44 == *puVar43) {
                  lVar16 = (ulong)uVar23 + 8;
                  lVar34 = 0;
                  do {
                    puVar22 = (ulong *)((long)puVar43 + lVar34 + 8);
                    if (puVar1 <= puVar22) {
                      puVar44 = (ulong *)(pBVar28 + lVar34 + lVar16);
                      goto LAB_006b1945;
                    }
                    lVar17 = lVar34 + lVar16;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                  uVar41 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar41 = *puVar43 ^ *puVar44;
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = uVar42 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_006b1945:
                if ((puVar22 < puVar2) && ((int)*puVar44 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar44 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar22 < puVar5) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar22));
                }
                uVar42 = (long)puVar22 - (long)puVar43;
              }
              if ((uVar40 < uVar42) &&
                 (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar40 = uVar42,
                 (ulong *)((long)puVar43 + uVar42) == puVar5)) break;
            }
            uVar42 = uVar40;
            lVar47 = lVar47 + 1;
            uVar40 = uVar42;
          } while (lVar47 != lVar26);
        }
      }
      else if (uVar23 - 6 < 2) {
        pBVar28 = (ms->window).base;
        uVar36 = (long)puVar43 - (long)pBVar28;
        uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar32 = (ms->window).lowLimit;
        uVar45 = (uint)uVar36;
        UVar35 = uVar45 - uVar23;
        if (uVar45 - UVar32 <= uVar23) {
          UVar35 = UVar32;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (ms->loadedDictEnd != 0) {
          UVar35 = UVar32;
        }
        uVar40 = (ulong)ms->nextToUpdate;
        bVar19 = 0x38 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar33 = (uint)uVar40 & 7;
            uVar23 = ms->hashCache[uVar33];
            ms->hashCache[uVar33] =
                 (U32)((ulong)(*(long *)(pBVar28 + uVar40 + 8) * -0x30e4432340650000) >>
                      (bVar19 & 0x3f));
            uVar42 = (ulong)(uVar23 >> 3 & 0xffffffe0);
            uVar33 = (byte)((char)pUVar13[uVar42] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar42) = (char)uVar33;
            *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar42 * 2) = (char)uVar23;
            pUVar12[uVar42 + uVar33] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < (uVar36 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar23 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (U32)((ulong)(*(long *)(pBVar28 + (uVar36 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (bVar19 & 0x3f));
        uVar36 = (ulong)(uVar23 >> 3 & 0xffffffe0);
        bVar19 = (byte)pUVar13[uVar36];
        pcVar8 = (char *)((long)pUVar13 + uVar36 * 2 + 1);
        pcVar9 = (char *)((long)pUVar13 + uVar36 * 2 + 0x11);
        uVar76 = (undefined1)(uVar23 >> 0x18);
        uVar74 = (undefined1)(uVar23 >> 0x10);
        uVar72 = (undefined1)(uVar23 >> 8);
        auVar78._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                  0x20);
        auVar78[3] = uVar72;
        auVar78[2] = uVar72;
        auVar78[0] = (undefined1)uVar23;
        auVar78[1] = auVar78[0];
        auVar78._8_8_ = 0;
        auVar79 = pshuflw(auVar78,auVar78,0);
        cVar54 = auVar79[0];
        auVar48[0] = -(*pcVar8 == cVar54);
        cVar73 = auVar79[1];
        auVar48[1] = -(pcVar8[1] == cVar73);
        cVar75 = auVar79[2];
        auVar48[2] = -(pcVar8[2] == cVar75);
        cVar77 = auVar79[3];
        auVar48[3] = -(pcVar8[3] == cVar77);
        auVar48[4] = -(pcVar8[4] == cVar54);
        auVar48[5] = -(pcVar8[5] == cVar73);
        auVar48[6] = -(pcVar8[6] == cVar75);
        auVar48[7] = -(pcVar8[7] == cVar77);
        auVar48[8] = -(pcVar8[8] == cVar54);
        auVar48[9] = -(pcVar8[9] == cVar73);
        auVar48[10] = -(pcVar8[10] == cVar75);
        auVar48[0xb] = -(pcVar8[0xb] == cVar77);
        auVar48[0xc] = -(pcVar8[0xc] == cVar54);
        auVar48[0xd] = -(pcVar8[0xd] == cVar73);
        auVar48[0xe] = -(pcVar8[0xe] == cVar75);
        auVar48[0xf] = -(pcVar8[0xf] == cVar77);
        auVar55[0] = -(*pcVar9 == cVar54);
        auVar55[1] = -(pcVar9[1] == cVar73);
        auVar55[2] = -(pcVar9[2] == cVar75);
        auVar55[3] = -(pcVar9[3] == cVar77);
        auVar55[4] = -(pcVar9[4] == cVar54);
        auVar55[5] = -(pcVar9[5] == cVar73);
        auVar55[6] = -(pcVar9[6] == cVar75);
        auVar55[7] = -(pcVar9[7] == cVar77);
        auVar55[8] = -(pcVar9[8] == cVar54);
        auVar55[9] = -(pcVar9[9] == cVar73);
        auVar55[10] = -(pcVar9[10] == cVar75);
        auVar55[0xb] = -(pcVar9[0xb] == cVar77);
        auVar55[0xc] = -(pcVar9[0xc] == cVar54);
        auVar55[0xd] = -(pcVar9[0xd] == cVar73);
        auVar55[0xe] = -(pcVar9[0xe] == cVar75);
        auVar55[0xf] = -(pcVar9[0xf] == cVar77);
        uVar33 = CONCAT22((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar55[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar48 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar48[0xf] >> 7) << 0xf);
        uVar23 = uVar33 >> (bVar19 & 0x1f) | uVar33 << 0x20 - (bVar19 & 0x1f);
        if ((bVar19 & 0x1f) == 0) {
          uVar23 = uVar33;
        }
        if (uVar23 == 0) {
          lVar26 = 0;
        }
        else {
          lVar47 = 0;
          while( true ) {
            iVar29 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
              }
            }
            lVar26 = lVar47;
            if (pUVar12[uVar36 + (iVar29 + (uint)bVar19 & 0x1f)] < UVar35) break;
            lVar26 = lVar47 + 1;
            auStack_b8[lVar47] = pUVar12[uVar36 + (iVar29 + (uint)bVar19 & 0x1f)];
            uVar23 = uVar23 & uVar23 - 1;
            if ((uVar23 == 0) || (iVar29 = (int)lVar47, lVar47 = lVar26, iVar29 == 0x1f)) break;
          }
        }
        uVar23 = bVar19 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar36) = (char)uVar23;
        *(undefined1 *)((long)(pUVar13 + uVar36) + (ulong)uVar23 + 1) = auVar78[0];
        UVar32 = ms->nextToUpdate;
        ms->nextToUpdate = UVar32 + 1;
        pUVar12[uVar36 + uVar23] = UVar32;
        if (lVar26 == 0) goto LAB_006b19c6;
        uVar36 = 999999999;
        lVar47 = 0;
        uVar40 = 3;
        do {
          uVar23 = auStack_b8[lVar47];
          puVar44 = (ulong *)(pBVar28 + uVar23);
          if (*(BYTE *)(uVar40 + (long)puVar44) == *(BYTE *)((long)puVar43 + uVar40)) {
            puVar22 = puVar43;
            if (puVar43 < puVar1) {
              if (*puVar44 == *puVar43) {
                lVar16 = (ulong)uVar23 + 8;
                lVar34 = 0;
                do {
                  puVar22 = (ulong *)((long)puVar43 + lVar34 + 8);
                  if (puVar1 <= puVar22) {
                    puVar44 = (ulong *)(pBVar28 + lVar34 + lVar16);
                    goto LAB_006b1283;
                  }
                  lVar17 = lVar34 + lVar16;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                uVar41 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                uVar42 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar41 = *puVar43 ^ *puVar44;
                uVar42 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006b1283:
              if ((puVar22 < puVar2) && ((int)*puVar44 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar44 = (ulong *)((long)puVar44 + 4);
              }
              if ((puVar22 < puVar3) && ((short)*puVar44 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar44 = (ulong *)((long)puVar44 + 2);
              }
              if (puVar22 < puVar5) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar22));
              }
              uVar42 = (long)puVar22 - (long)puVar43;
            }
            if ((uVar40 < uVar42) &&
               (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar40 = uVar42,
               (ulong *)((long)puVar43 + uVar42) == puVar5)) break;
          }
          uVar42 = uVar40;
          lVar47 = lVar47 + 1;
          uVar40 = uVar42;
        } while (lVar47 != lVar26);
      }
      else if (uVar23 == 5) {
        pBVar28 = (ms->window).base;
        uVar36 = (long)puVar43 - (long)pBVar28;
        uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar32 = (ms->window).lowLimit;
        uVar45 = (uint)uVar36;
        UVar35 = uVar45 - uVar23;
        if (uVar45 - UVar32 <= uVar23) {
          UVar35 = UVar32;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (ms->loadedDictEnd != 0) {
          UVar35 = UVar32;
        }
        uVar40 = (ulong)ms->nextToUpdate;
        bVar19 = 0x38 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar33 = (uint)uVar40 & 7;
            uVar23 = ms->hashCache[uVar33];
            ms->hashCache[uVar33] =
                 (U32)((ulong)(*(long *)(pBVar28 + uVar40 + 8) * -0x30e4432345000000) >>
                      (bVar19 & 0x3f));
            uVar42 = (ulong)(uVar23 >> 3 & 0xffffffe0);
            uVar33 = (byte)((char)pUVar13[uVar42] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar42) = (char)uVar33;
            *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar42 * 2) = (char)uVar23;
            pUVar12[uVar42 + uVar33] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < (uVar36 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar23 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (U32)((ulong)(*(long *)(pBVar28 + (uVar36 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (bVar19 & 0x3f));
        uVar36 = (ulong)(uVar23 >> 3 & 0xffffffe0);
        bVar19 = (byte)pUVar13[uVar36];
        pcVar8 = (char *)((long)pUVar13 + uVar36 * 2 + 1);
        pcVar9 = (char *)((long)pUVar13 + uVar36 * 2 + 0x11);
        uVar76 = (undefined1)(uVar23 >> 0x18);
        uVar74 = (undefined1)(uVar23 >> 0x10);
        uVar72 = (undefined1)(uVar23 >> 8);
        auVar80._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                  0x20);
        auVar80[3] = uVar72;
        auVar80[2] = uVar72;
        auVar80[0] = (undefined1)uVar23;
        auVar80[1] = auVar80[0];
        auVar80._8_8_ = 0;
        auVar79 = pshuflw(auVar80,auVar80,0);
        cVar54 = auVar79[0];
        auVar49[0] = -(*pcVar8 == cVar54);
        cVar73 = auVar79[1];
        auVar49[1] = -(pcVar8[1] == cVar73);
        cVar75 = auVar79[2];
        auVar49[2] = -(pcVar8[2] == cVar75);
        cVar77 = auVar79[3];
        auVar49[3] = -(pcVar8[3] == cVar77);
        auVar49[4] = -(pcVar8[4] == cVar54);
        auVar49[5] = -(pcVar8[5] == cVar73);
        auVar49[6] = -(pcVar8[6] == cVar75);
        auVar49[7] = -(pcVar8[7] == cVar77);
        auVar49[8] = -(pcVar8[8] == cVar54);
        auVar49[9] = -(pcVar8[9] == cVar73);
        auVar49[10] = -(pcVar8[10] == cVar75);
        auVar49[0xb] = -(pcVar8[0xb] == cVar77);
        auVar49[0xc] = -(pcVar8[0xc] == cVar54);
        auVar49[0xd] = -(pcVar8[0xd] == cVar73);
        auVar49[0xe] = -(pcVar8[0xe] == cVar75);
        auVar49[0xf] = -(pcVar8[0xf] == cVar77);
        auVar58[0] = -(*pcVar9 == cVar54);
        auVar58[1] = -(pcVar9[1] == cVar73);
        auVar58[2] = -(pcVar9[2] == cVar75);
        auVar58[3] = -(pcVar9[3] == cVar77);
        auVar58[4] = -(pcVar9[4] == cVar54);
        auVar58[5] = -(pcVar9[5] == cVar73);
        auVar58[6] = -(pcVar9[6] == cVar75);
        auVar58[7] = -(pcVar9[7] == cVar77);
        auVar58[8] = -(pcVar9[8] == cVar54);
        auVar58[9] = -(pcVar9[9] == cVar73);
        auVar58[10] = -(pcVar9[10] == cVar75);
        auVar58[0xb] = -(pcVar9[0xb] == cVar77);
        auVar58[0xc] = -(pcVar9[0xc] == cVar54);
        auVar58[0xd] = -(pcVar9[0xd] == cVar73);
        auVar58[0xe] = -(pcVar9[0xe] == cVar75);
        auVar58[0xf] = -(pcVar9[0xf] == cVar77);
        uVar33 = CONCAT22((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar58[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar49 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar49[0xf] >> 7) << 0xf);
        uVar23 = uVar33 >> (bVar19 & 0x1f) | uVar33 << 0x20 - (bVar19 & 0x1f);
        if ((bVar19 & 0x1f) == 0) {
          uVar23 = uVar33;
        }
        if (uVar23 == 0) {
          lVar26 = 0;
        }
        else {
          lVar47 = 0;
          while( true ) {
            iVar29 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
              }
            }
            lVar26 = lVar47;
            if (pUVar12[uVar36 + (iVar29 + (uint)bVar19 & 0x1f)] < UVar35) break;
            lVar26 = lVar47 + 1;
            auStack_b8[lVar47] = pUVar12[uVar36 + (iVar29 + (uint)bVar19 & 0x1f)];
            uVar23 = uVar23 & uVar23 - 1;
            if ((uVar23 == 0) || (iVar29 = (int)lVar47, lVar47 = lVar26, iVar29 == 0x1f)) break;
          }
        }
        uVar23 = bVar19 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar36) = (char)uVar23;
        *(undefined1 *)((long)(pUVar13 + uVar36) + (ulong)uVar23 + 1) = auVar80[0];
        UVar32 = ms->nextToUpdate;
        ms->nextToUpdate = UVar32 + 1;
        pUVar12[uVar36 + uVar23] = UVar32;
        if (lVar26 == 0) {
LAB_006b19c6:
          uVar42 = 3;
          uVar36 = 999999999;
        }
        else {
          uVar36 = 999999999;
          lVar47 = 0;
          uVar40 = 3;
          do {
            uVar23 = auStack_b8[lVar47];
            puVar44 = (ulong *)(pBVar28 + uVar23);
            if (*(BYTE *)(uVar40 + (long)puVar44) == *(BYTE *)((long)puVar43 + uVar40)) {
              puVar22 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar44 == *puVar43) {
                  lVar16 = (ulong)uVar23 + 8;
                  lVar34 = 0;
                  do {
                    puVar22 = (ulong *)((long)puVar43 + lVar34 + 8);
                    if (puVar1 <= puVar22) {
                      puVar44 = (ulong *)(pBVar28 + lVar34 + lVar16);
                      goto LAB_006b1556;
                    }
                    lVar17 = lVar34 + lVar16;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                  uVar41 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar41 = *puVar43 ^ *puVar44;
                  uVar42 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = uVar42 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_006b1556:
                if ((puVar22 < puVar2) && ((int)*puVar44 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar22 < puVar3) && ((short)*puVar44 == (short)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar22 < puVar5) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar22));
                }
                uVar42 = (long)puVar22 - (long)puVar43;
              }
              if ((uVar40 < uVar42) &&
                 (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar40 = uVar42,
                 (ulong *)((long)puVar43 + uVar42) == puVar5)) break;
            }
            uVar42 = uVar40;
            lVar47 = lVar47 + 1;
            uVar40 = uVar42;
          } while (lVar47 != lVar26);
        }
      }
      else {
        pBVar28 = (ms->window).base;
        uVar36 = (long)puVar43 - (long)pBVar28;
        uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar32 = (ms->window).lowLimit;
        uVar45 = (uint)uVar36;
        UVar35 = uVar45 - uVar23;
        if (uVar45 - UVar32 <= uVar23) {
          UVar35 = UVar32;
        }
        pUVar12 = ms->hashTable;
        pUVar13 = ms->tagTable;
        if (ms->loadedDictEnd != 0) {
          UVar35 = UVar32;
        }
        uVar40 = (ulong)ms->nextToUpdate;
        bVar19 = 0x18 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar45) {
          do {
            uVar33 = (uint)uVar40 & 7;
            uVar23 = ms->hashCache[uVar33];
            ms->hashCache[uVar33] =
                 (uint)(*(int *)(pBVar28 + uVar40 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
            uVar42 = (ulong)(uVar23 >> 3 & 0xffffffe0);
            uVar33 = (byte)((char)pUVar13[uVar42] - 1) & 0x1f;
            *(char *)(pUVar13 + uVar42) = (char)uVar33;
            *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar42 * 2) = (char)uVar23;
            pUVar12[uVar42 + uVar33] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < (uVar36 & 0xffffffff));
        }
        ms->nextToUpdate = uVar45;
        uVar23 = ms->hashCache[uVar45 & 7];
        ms->hashCache[uVar45 & 7] =
             (uint)(*(int *)(pBVar28 + (uVar36 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
        uVar36 = (ulong)(uVar23 >> 3 & 0xffffffe0);
        bVar19 = (byte)pUVar13[uVar36];
        pcVar8 = (char *)((long)pUVar13 + uVar36 * 2 + 1);
        pcVar9 = (char *)((long)pUVar13 + uVar36 * 2 + 0x11);
        uVar76 = (undefined1)(uVar23 >> 0x18);
        uVar74 = (undefined1)(uVar23 >> 0x10);
        uVar72 = (undefined1)(uVar23 >> 8);
        auVar81._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                  0x20);
        auVar81[3] = uVar72;
        auVar81[2] = uVar72;
        auVar81[0] = (undefined1)uVar23;
        auVar81[1] = auVar81[0];
        auVar81._8_8_ = 0;
        auVar79 = pshuflw(auVar81,auVar81,0);
        cVar54 = auVar79[0];
        auVar50[0] = -(*pcVar8 == cVar54);
        cVar73 = auVar79[1];
        auVar50[1] = -(pcVar8[1] == cVar73);
        cVar75 = auVar79[2];
        auVar50[2] = -(pcVar8[2] == cVar75);
        cVar77 = auVar79[3];
        auVar50[3] = -(pcVar8[3] == cVar77);
        auVar50[4] = -(pcVar8[4] == cVar54);
        auVar50[5] = -(pcVar8[5] == cVar73);
        auVar50[6] = -(pcVar8[6] == cVar75);
        auVar50[7] = -(pcVar8[7] == cVar77);
        auVar50[8] = -(pcVar8[8] == cVar54);
        auVar50[9] = -(pcVar8[9] == cVar73);
        auVar50[10] = -(pcVar8[10] == cVar75);
        auVar50[0xb] = -(pcVar8[0xb] == cVar77);
        auVar50[0xc] = -(pcVar8[0xc] == cVar54);
        auVar50[0xd] = -(pcVar8[0xd] == cVar73);
        auVar50[0xe] = -(pcVar8[0xe] == cVar75);
        auVar50[0xf] = -(pcVar8[0xf] == cVar77);
        auVar60[0] = -(*pcVar9 == cVar54);
        auVar60[1] = -(pcVar9[1] == cVar73);
        auVar60[2] = -(pcVar9[2] == cVar75);
        auVar60[3] = -(pcVar9[3] == cVar77);
        auVar60[4] = -(pcVar9[4] == cVar54);
        auVar60[5] = -(pcVar9[5] == cVar73);
        auVar60[6] = -(pcVar9[6] == cVar75);
        auVar60[7] = -(pcVar9[7] == cVar77);
        auVar60[8] = -(pcVar9[8] == cVar54);
        auVar60[9] = -(pcVar9[9] == cVar73);
        auVar60[10] = -(pcVar9[10] == cVar75);
        auVar60[0xb] = -(pcVar9[0xb] == cVar77);
        auVar60[0xc] = -(pcVar9[0xc] == cVar54);
        auVar60[0xd] = -(pcVar9[0xd] == cVar73);
        auVar60[0xe] = -(pcVar9[0xe] == cVar75);
        auVar60[0xf] = -(pcVar9[0xf] == cVar77);
        uVar33 = CONCAT22((ushort)(SUB161(auVar60 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar60[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar50 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar50[0xf] >> 7) << 0xf);
        uVar23 = uVar33 >> (bVar19 & 0x1f) | uVar33 << 0x20 - (bVar19 & 0x1f);
        if ((bVar19 & 0x1f) == 0) {
          uVar23 = uVar33;
        }
        if (uVar23 == 0) {
          lVar26 = 0;
        }
        else {
          lVar47 = 0;
          while( true ) {
            iVar29 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
              }
            }
            lVar26 = lVar47;
            if (pUVar12[uVar36 + (iVar29 + (uint)bVar19 & 0x1f)] < UVar35) break;
            lVar26 = lVar47 + 1;
            auStack_b8[lVar47] = pUVar12[uVar36 + (iVar29 + (uint)bVar19 & 0x1f)];
            uVar23 = uVar23 & uVar23 - 1;
            if ((uVar23 == 0) || (iVar29 = (int)lVar47, lVar47 = lVar26, iVar29 == 0x1f)) break;
          }
        }
        uVar23 = bVar19 - 1 & 0x1f;
        *(char *)(pUVar13 + uVar36) = (char)uVar23;
        *(undefined1 *)((long)(pUVar13 + uVar36) + (ulong)uVar23 + 1) = auVar81[0];
        UVar32 = ms->nextToUpdate;
        ms->nextToUpdate = UVar32 + 1;
        pUVar12[uVar36 + uVar23] = UVar32;
        if (lVar26 == 0) goto LAB_006b19c6;
        uVar36 = 999999999;
        lVar47 = 0;
        uVar40 = 3;
        do {
          uVar23 = auStack_b8[lVar47];
          puVar44 = (ulong *)(pBVar28 + uVar23);
          if (*(BYTE *)(uVar40 + (long)puVar44) == *(BYTE *)((long)puVar43 + uVar40)) {
            puVar22 = puVar43;
            if (puVar43 < puVar1) {
              if (*puVar44 == *puVar43) {
                lVar16 = (ulong)uVar23 + 8;
                lVar34 = 0;
                do {
                  puVar22 = (ulong *)((long)puVar43 + lVar34 + 8);
                  if (puVar1 <= puVar22) {
                    puVar44 = (ulong *)(pBVar28 + lVar34 + lVar16);
                    goto LAB_006b17f1;
                  }
                  lVar17 = lVar34 + lVar16;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                uVar41 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                uVar42 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar41 = *puVar43 ^ *puVar44;
                uVar42 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006b17f1:
              if ((puVar22 < puVar2) && ((int)*puVar44 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar44 = (ulong *)((long)puVar44 + 4);
              }
              if ((puVar22 < puVar3) && ((short)*puVar44 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar44 = (ulong *)((long)puVar44 + 2);
              }
              if (puVar22 < puVar5) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar22));
              }
              uVar42 = (long)puVar22 - (long)puVar43;
            }
            if ((uVar40 < uVar42) &&
               (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar40 = uVar42,
               (ulong *)((long)puVar43 + uVar42) == puVar5)) break;
          }
          uVar42 = uVar40;
          lVar47 = lVar47 + 1;
          uVar40 = uVar42;
        } while (lVar47 != lVar26);
      }
      uVar40 = uVar25;
      if (uVar25 < uVar42) {
        uVar40 = uVar42;
      }
      if (uVar40 < 4) {
        puVar43 = (ulong *)((long)puVar43 + ((long)puVar43 - (long)src >> 8) + 1);
      }
      else {
        puVar44 = puVar43;
        if (uVar42 <= uVar25) {
          uVar36 = 0;
          puVar44 = (ulong *)((long)puVar43 + 1U);
        }
        local_110 = (ulong *)((long)puVar43 + 0xd);
        local_178 = (BYTE *)((long)puVar43 + 9);
        do {
          uVar25 = uVar40;
          local_140 = uVar36;
          local_f8 = puVar44;
          if (iLimit <= puVar43) break;
          puVar44 = (ulong *)((long)puVar43 + 1);
          if (uVar36 == 0) {
            local_140 = 0;
          }
          else if ((uVar24 != 0) && (*(int *)puVar44 == *(int *)((long)puVar44 + lVar46))) {
            puVar22 = (ulong *)((long)puVar43 + 5);
            puVar21 = (ulong *)((long)puVar43 + lVar46 + 5);
            puVar27 = puVar22;
            if (puVar22 < puVar1) {
              puVar27 = local_110;
              if (*puVar21 == *puVar22) {
                do {
                  if (puVar1 <= puVar27) {
                    puVar21 = (ulong *)((long)puVar27 + lVar46);
                    goto LAB_006b1afc;
                  }
                  puVar21 = (ulong *)((long)puVar27 + lVar46);
                  uVar37 = *puVar27;
                  puVar27 = puVar27 + 1;
                } while (*puVar21 == uVar37);
                uVar37 = uVar37 ^ *puVar21;
                uVar40 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                puVar27 = (ulong *)((long)puVar27 + ((uVar40 >> 3 & 0x1fffffff) - 8));
                goto LAB_006b1b3e;
              }
              uVar40 = *puVar22 ^ *puVar21;
              uVar37 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                }
              }
              uVar37 = uVar37 >> 3 & 0x1fffffff;
              uVar23 = (int)uVar36 + 1;
              uVar45 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar45 == 0; uVar45 = uVar45 - 1) {
                }
              }
            }
            else {
LAB_006b1afc:
              if ((puVar27 < puVar2) && ((int)*puVar21 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar21 = (ulong *)((long)puVar21 + 4);
              }
              if ((puVar27 < puVar3) && ((short)*puVar21 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar21 = (ulong *)((long)puVar21 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar27));
              }
LAB_006b1b3e:
              uVar37 = (long)puVar27 - (long)puVar22;
              if (0xfffffffffffffffb < uVar37) goto LAB_006b1b83;
              uVar23 = (int)uVar36 + 1;
              uVar45 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar45 == 0; uVar45 = uVar45 - 1) {
                }
              }
            }
            if ((int)((int)uVar25 * 3 + (uVar45 ^ 0x1f) + -0x1e) < (int)(uVar37 + 4) * 3) {
              local_140 = 0;
              uVar25 = uVar37 + 4;
              local_f8 = puVar44;
            }
          }
LAB_006b1b83:
          uVar45 = (ms->cParams).searchLog;
          uVar23 = (ms->cParams).minMatch;
          if (uVar45 < 5) {
            bVar19 = (byte)uVar45;
            if (uVar23 - 6 < 2) {
              pBVar28 = (ms->window).base;
              uVar37 = (long)puVar44 - (long)pBVar28;
              uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar45 = (ms->window).lowLimit;
              uVar33 = (uint)uVar37;
              uVar23 = uVar33 - uVar31;
              if (uVar33 - uVar45 <= uVar31) {
                uVar23 = uVar45;
              }
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              if (ms->loadedDictEnd != 0) {
                uVar23 = uVar45;
              }
              uVar36 = (ulong)ms->nextToUpdate;
              bVar20 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar33) {
                do {
                  uVar31 = (uint)uVar36 & 7;
                  uVar45 = ms->hashCache[uVar31];
                  ms->hashCache[uVar31] =
                       (U32)((ulong)(*(long *)(pBVar28 + uVar36 + 8) * -0x30e4432340650000) >>
                            (bVar20 & 0x3f));
                  uVar40 = (ulong)(uVar45 >> 4 & 0xfffffff0);
                  uVar31 = (byte)((char)pUVar13[uVar40] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar40) = (char)uVar31;
                  *(char *)((long)pUVar13 + (ulong)uVar31 + 1 + uVar40 * 2) = (char)uVar45;
                  pUVar12[uVar40 + uVar31] = (uint)uVar36;
                  uVar36 = uVar36 + 1;
                } while (uVar36 < (uVar37 & 0xffffffff));
              }
              ms->nextToUpdate = uVar33;
              uVar45 = ms->hashCache[uVar33 & 7];
              ms->hashCache[uVar33 & 7] =
                   (U32)((ulong)(*(long *)(pBVar28 + (uVar37 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (bVar20 & 0x3f));
              uVar37 = (ulong)(uVar45 >> 4 & 0xfffffff0);
              bVar20 = (byte)pUVar13[uVar37];
              pcVar8 = (char *)((long)pUVar13 + uVar37 * 2 + 1);
              uVar76 = (undefined1)(uVar45 >> 0x18);
              uVar74 = (undefined1)(uVar45 >> 0x10);
              uVar72 = (undefined1)(uVar45 >> 8);
              auVar64._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar45))
                        >> 0x20);
              auVar64[3] = uVar72;
              auVar64[2] = uVar72;
              auVar64[0] = (undefined1)uVar45;
              auVar64[1] = auVar64[0];
              auVar64._8_8_ = 0;
              auVar79 = pshuflw(auVar64,auVar64,0);
              cVar54 = auVar79[0];
              auVar65[0] = -(cVar54 == *pcVar8);
              cVar73 = auVar79[1];
              auVar65[1] = -(cVar73 == pcVar8[1]);
              cVar75 = auVar79[2];
              auVar65[2] = -(cVar75 == pcVar8[2]);
              cVar77 = auVar79[3];
              auVar65[3] = -(cVar77 == pcVar8[3]);
              auVar65[4] = -(cVar54 == pcVar8[4]);
              auVar65[5] = -(cVar73 == pcVar8[5]);
              auVar65[6] = -(cVar75 == pcVar8[6]);
              auVar65[7] = -(cVar77 == pcVar8[7]);
              auVar65[8] = -(cVar54 == pcVar8[8]);
              auVar65[9] = -(cVar73 == pcVar8[9]);
              auVar65[10] = -(cVar75 == pcVar8[10]);
              auVar65[0xb] = -(cVar77 == pcVar8[0xb]);
              auVar65[0xc] = -(cVar54 == pcVar8[0xc]);
              auVar65[0xd] = -(cVar73 == pcVar8[0xd]);
              auVar65[0xe] = -(cVar75 == pcVar8[0xe]);
              auVar65[0xf] = -(cVar77 == pcVar8[0xf]);
              uVar14 = (ushort)(SUB161(auVar65 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar65[0xf] >> 7) << 0xf;
              uVar45 = (uint)uVar14;
              if ((bVar20 & 0xf) != 0) {
                uVar45 = (uint)uVar14 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar14 >> (bVar20 & 0xf));
              }
              if (uVar45 == 0) {
                lVar26 = 0;
              }
              else {
                lVar47 = 0;
                while( true ) {
                  iVar29 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                    }
                  }
                  lVar26 = lVar47;
                  if (pUVar12[uVar37 + (iVar29 + (uint)bVar20 & 0xf)] < uVar23) break;
                  lVar26 = lVar47 + 1;
                  auStack_b8[lVar47] = pUVar12[uVar37 + (iVar29 + (uint)bVar20 & 0xf)];
                  uVar45 = uVar45 & uVar45 - 1;
                  if ((uVar45 == 0) ||
                     (iVar29 = (int)lVar47, lVar47 = lVar26,
                     (int)(1L << (bVar19 & 0x3f)) + -1 == iVar29)) break;
                }
              }
              uVar45 = bVar20 - 1 & 0xf;
              *(char *)(pUVar13 + uVar37) = (char)uVar45;
              *(undefined1 *)((long)(pUVar13 + uVar37) + (ulong)uVar45 + 1) = auVar64[0];
              UVar32 = ms->nextToUpdate;
              ms->nextToUpdate = UVar32 + 1;
              pUVar12[uVar37 + uVar45] = UVar32;
              if (lVar26 == 0) {
                uVar40 = 3;
                uVar36 = 999999999;
              }
              else {
                uVar36 = 999999999;
                lVar47 = 0;
                uVar37 = 3;
                do {
                  uVar45 = auStack_b8[lVar47];
                  puVar43 = (ulong *)(pBVar28 + uVar45);
                  if (*(BYTE *)(uVar37 + (long)puVar43) == *(BYTE *)((long)puVar44 + uVar37)) {
                    puVar22 = puVar44;
                    if (puVar44 < puVar1) {
                      if (*puVar43 == *puVar44) {
                        lVar16 = (ulong)uVar45 + 8;
                        lVar34 = 0;
                        do {
                          puVar22 = (ulong *)(local_178 + lVar34);
                          if (puVar1 <= puVar22) {
                            puVar43 = (ulong *)(pBVar28 + lVar34 + lVar16);
                            goto LAB_006b2860;
                          }
                          lVar17 = lVar34 + lVar16;
                          lVar34 = lVar34 + 8;
                        } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                        uVar42 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                        uVar40 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                      }
                      else {
                        uVar42 = *puVar44 ^ *puVar43;
                        uVar40 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        uVar40 = uVar40 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006b2860:
                      if ((puVar22 < puVar2) && ((int)*puVar43 == (int)*puVar22)) {
                        puVar22 = (ulong *)((long)puVar22 + 4);
                        puVar43 = (ulong *)((long)puVar43 + 4);
                      }
                      if ((puVar22 < puVar3) && ((short)*puVar43 == (short)*puVar22)) {
                        puVar22 = (ulong *)((long)puVar22 + 2);
                        puVar43 = (ulong *)((long)puVar43 + 2);
                      }
                      if (puVar22 < puVar5) {
                        puVar22 = (ulong *)((long)puVar22 +
                                           (ulong)((BYTE)*puVar43 == (BYTE)*puVar22));
                      }
                      uVar40 = (long)puVar22 - (long)puVar44;
                    }
                    if ((uVar37 < uVar40) &&
                       (uVar36 = (ulong)((uVar33 + 2) - uVar45), uVar37 = uVar40,
                       (ulong *)((long)puVar44 + uVar40) == puVar5)) break;
                  }
                  uVar40 = uVar37;
                  lVar47 = lVar47 + 1;
                  uVar37 = uVar40;
                } while (lVar47 != lVar26);
              }
            }
            else if (uVar23 == 5) {
              pBVar28 = (ms->window).base;
              uVar37 = (long)puVar44 - (long)pBVar28;
              uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar45 = (ms->window).lowLimit;
              uVar31 = (uint)uVar37;
              uVar23 = uVar31 - uVar33;
              if (uVar31 - uVar45 <= uVar33) {
                uVar23 = uVar45;
              }
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              if (ms->loadedDictEnd != 0) {
                uVar23 = uVar45;
              }
              uVar36 = (ulong)ms->nextToUpdate;
              bVar20 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar31) {
                do {
                  uVar33 = (uint)uVar36 & 7;
                  uVar45 = ms->hashCache[uVar33];
                  ms->hashCache[uVar33] =
                       (U32)((ulong)(*(long *)(pBVar28 + uVar36 + 8) * -0x30e4432345000000) >>
                            (bVar20 & 0x3f));
                  uVar40 = (ulong)(uVar45 >> 4 & 0xfffffff0);
                  uVar33 = (byte)((char)pUVar13[uVar40] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar40) = (char)uVar33;
                  *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar40 * 2) = (char)uVar45;
                  pUVar12[uVar40 + uVar33] = (uint)uVar36;
                  uVar36 = uVar36 + 1;
                } while (uVar36 < (uVar37 & 0xffffffff));
              }
              ms->nextToUpdate = uVar31;
              uVar45 = ms->hashCache[uVar31 & 7];
              ms->hashCache[uVar31 & 7] =
                   (U32)((ulong)(*(long *)(pBVar28 + (uVar37 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (bVar20 & 0x3f));
              uVar37 = (ulong)(uVar45 >> 4 & 0xfffffff0);
              bVar20 = (byte)pUVar13[uVar37];
              pcVar8 = (char *)((long)pUVar13 + uVar37 * 2 + 1);
              uVar76 = (undefined1)(uVar45 >> 0x18);
              uVar74 = (undefined1)(uVar45 >> 0x10);
              uVar72 = (undefined1)(uVar45 >> 8);
              auVar67._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar45))
                        >> 0x20);
              auVar67[3] = uVar72;
              auVar67[2] = uVar72;
              auVar67[0] = (undefined1)uVar45;
              auVar67[1] = auVar67[0];
              auVar67._8_8_ = 0;
              auVar79 = pshuflw(auVar67,auVar67,0);
              cVar54 = auVar79[0];
              auVar68[0] = -(cVar54 == *pcVar8);
              cVar73 = auVar79[1];
              auVar68[1] = -(cVar73 == pcVar8[1]);
              cVar75 = auVar79[2];
              auVar68[2] = -(cVar75 == pcVar8[2]);
              cVar77 = auVar79[3];
              auVar68[3] = -(cVar77 == pcVar8[3]);
              auVar68[4] = -(cVar54 == pcVar8[4]);
              auVar68[5] = -(cVar73 == pcVar8[5]);
              auVar68[6] = -(cVar75 == pcVar8[6]);
              auVar68[7] = -(cVar77 == pcVar8[7]);
              auVar68[8] = -(cVar54 == pcVar8[8]);
              auVar68[9] = -(cVar73 == pcVar8[9]);
              auVar68[10] = -(cVar75 == pcVar8[10]);
              auVar68[0xb] = -(cVar77 == pcVar8[0xb]);
              auVar68[0xc] = -(cVar54 == pcVar8[0xc]);
              auVar68[0xd] = -(cVar73 == pcVar8[0xd]);
              auVar68[0xe] = -(cVar75 == pcVar8[0xe]);
              auVar68[0xf] = -(cVar77 == pcVar8[0xf]);
              uVar14 = (ushort)(SUB161(auVar68 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar68[0xf] >> 7) << 0xf;
              uVar45 = (uint)uVar14;
              if ((bVar20 & 0xf) != 0) {
                uVar45 = (uint)uVar14 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar14 >> (bVar20 & 0xf));
              }
              if (uVar45 == 0) {
                lVar26 = 0;
              }
              else {
                lVar47 = 0;
                while( true ) {
                  iVar29 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                    }
                  }
                  lVar26 = lVar47;
                  if (pUVar12[uVar37 + (iVar29 + (uint)bVar20 & 0xf)] < uVar23) break;
                  lVar26 = lVar47 + 1;
                  auStack_b8[lVar47] = pUVar12[uVar37 + (iVar29 + (uint)bVar20 & 0xf)];
                  uVar45 = uVar45 & uVar45 - 1;
                  if ((uVar45 == 0) ||
                     (iVar29 = (int)lVar47, lVar47 = lVar26, (1 << (bVar19 & 0x1f)) + -1 == iVar29))
                  break;
                }
              }
              uVar45 = bVar20 - 1 & 0xf;
              *(char *)(pUVar13 + uVar37) = (char)uVar45;
              *(undefined1 *)((long)(pUVar13 + uVar37) + (ulong)uVar45 + 1) = auVar67[0];
              UVar32 = ms->nextToUpdate;
              ms->nextToUpdate = UVar32 + 1;
              pUVar12[uVar37 + uVar45] = UVar32;
              if (lVar26 == 0) {
                uVar40 = 3;
                uVar36 = 999999999;
              }
              else {
                uVar36 = 999999999;
                lVar47 = 0;
                uVar37 = 3;
                do {
                  uVar45 = auStack_b8[lVar47];
                  puVar22 = (ulong *)(pBVar28 + uVar45);
                  if (*(BYTE *)(uVar37 + (long)puVar22) == *(BYTE *)((long)puVar44 + uVar37)) {
                    puVar21 = puVar44;
                    if (puVar44 < puVar1) {
                      if (*puVar22 == *puVar44) {
                        lVar16 = (ulong)uVar45 + 8;
                        lVar34 = 0;
                        do {
                          if (puVar1 <= local_178 + lVar34) {
                            puVar22 = (ulong *)(pBVar28 + lVar34 + lVar16);
                            puVar21 = (ulong *)(local_178 + lVar34);
                            goto LAB_006b2b5b;
                          }
                          lVar17 = lVar34 + lVar16;
                          uVar40 = *(ulong *)((long)puVar43 + lVar34 + 9);
                          lVar34 = lVar34 + 8;
                        } while (*(ulong *)(pBVar28 + lVar17) == uVar40);
                        uVar40 = uVar40 ^ *(ulong *)(pBVar28 + lVar17);
                        uVar42 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                          }
                        }
                        uVar40 = (uVar42 >> 3 & 0x1fffffff) + lVar34;
                      }
                      else {
                        uVar42 = *puVar44 ^ *puVar22;
                        uVar40 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        uVar40 = uVar40 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006b2b5b:
                      if ((puVar21 < puVar2) && ((int)*puVar22 == (int)*puVar21)) {
                        puVar21 = (ulong *)((long)puVar21 + 4);
                        puVar22 = (ulong *)((long)puVar22 + 4);
                      }
                      if ((puVar21 < puVar3) && ((short)*puVar22 == (short)*puVar21)) {
                        puVar21 = (ulong *)((long)puVar21 + 2);
                        puVar22 = (ulong *)((long)puVar22 + 2);
                      }
                      if (puVar21 < puVar5) {
                        puVar21 = (ulong *)((long)puVar21 +
                                           (ulong)((BYTE)*puVar22 == (BYTE)*puVar21));
                      }
                      uVar40 = (long)puVar21 - (long)puVar44;
                    }
                    if ((uVar37 < uVar40) &&
                       (uVar36 = (ulong)((uVar31 + 2) - uVar45), uVar37 = uVar40,
                       (ulong *)((long)puVar44 + uVar40) == puVar5)) break;
                  }
                  uVar40 = uVar37;
                  lVar47 = lVar47 + 1;
                  uVar37 = uVar40;
                } while (lVar47 != lVar26);
              }
            }
            else {
              pBVar28 = (ms->window).base;
              uVar37 = (long)puVar44 - (long)pBVar28;
              uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar45 = (ms->window).lowLimit;
              uVar31 = (uint)uVar37;
              uVar23 = uVar31 - uVar33;
              if (uVar31 - uVar45 <= uVar33) {
                uVar23 = uVar45;
              }
              pUVar12 = ms->hashTable;
              pUVar13 = ms->tagTable;
              if (ms->loadedDictEnd != 0) {
                uVar23 = uVar45;
              }
              uVar36 = (ulong)ms->nextToUpdate;
              bVar20 = 0x18 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar31) {
                do {
                  uVar33 = (uint)uVar36 & 7;
                  uVar45 = ms->hashCache[uVar33];
                  ms->hashCache[uVar33] =
                       (uint)(*(int *)(pBVar28 + uVar36 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
                  uVar40 = (ulong)(uVar45 >> 4 & 0xfffffff0);
                  uVar33 = (byte)((char)pUVar13[uVar40] - 1) & 0xf;
                  *(char *)(pUVar13 + uVar40) = (char)uVar33;
                  *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar40 * 2) = (char)uVar45;
                  pUVar12[uVar40 + uVar33] = (uint)uVar36;
                  uVar36 = uVar36 + 1;
                } while (uVar36 < (uVar37 & 0xffffffff));
              }
              ms->nextToUpdate = uVar31;
              uVar45 = ms->hashCache[uVar31 & 7];
              ms->hashCache[uVar31 & 7] =
                   (uint)(*(int *)(pBVar28 + (uVar37 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (bVar20 & 0x1f);
              uVar37 = (ulong)(uVar45 >> 4 & 0xfffffff0);
              bVar20 = (byte)pUVar13[uVar37];
              pcVar8 = (char *)((long)pUVar13 + uVar37 * 2 + 1);
              uVar76 = (undefined1)(uVar45 >> 0x18);
              uVar74 = (undefined1)(uVar45 >> 0x10);
              uVar72 = (undefined1)(uVar45 >> 8);
              auVar70._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar45))
                        >> 0x20);
              auVar70[3] = uVar72;
              auVar70[2] = uVar72;
              auVar70[0] = (undefined1)uVar45;
              auVar70[1] = auVar70[0];
              auVar70._8_8_ = 0;
              auVar79 = pshuflw(auVar70,auVar70,0);
              cVar54 = auVar79[0];
              auVar71[0] = -(cVar54 == *pcVar8);
              cVar73 = auVar79[1];
              auVar71[1] = -(cVar73 == pcVar8[1]);
              cVar75 = auVar79[2];
              auVar71[2] = -(cVar75 == pcVar8[2]);
              cVar77 = auVar79[3];
              auVar71[3] = -(cVar77 == pcVar8[3]);
              auVar71[4] = -(cVar54 == pcVar8[4]);
              auVar71[5] = -(cVar73 == pcVar8[5]);
              auVar71[6] = -(cVar75 == pcVar8[6]);
              auVar71[7] = -(cVar77 == pcVar8[7]);
              auVar71[8] = -(cVar54 == pcVar8[8]);
              auVar71[9] = -(cVar73 == pcVar8[9]);
              auVar71[10] = -(cVar75 == pcVar8[10]);
              auVar71[0xb] = -(cVar77 == pcVar8[0xb]);
              auVar71[0xc] = -(cVar54 == pcVar8[0xc]);
              auVar71[0xd] = -(cVar73 == pcVar8[0xd]);
              auVar71[0xe] = -(cVar75 == pcVar8[0xe]);
              auVar71[0xf] = -(cVar77 == pcVar8[0xf]);
              uVar14 = (ushort)(SUB161(auVar71 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar71[0xf] >> 7) << 0xf;
              uVar45 = (uint)uVar14;
              if ((bVar20 & 0xf) != 0) {
                uVar45 = (uint)uVar14 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar14 >> (bVar20 & 0xf));
              }
              if (uVar45 == 0) {
                lVar26 = 0;
              }
              else {
                lVar47 = 0;
                while( true ) {
                  iVar29 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                    }
                  }
                  lVar26 = lVar47;
                  if (pUVar12[uVar37 + (iVar29 + (uint)bVar20 & 0xf)] < uVar23) break;
                  lVar26 = lVar47 + 1;
                  auStack_b8[lVar47] = pUVar12[uVar37 + (iVar29 + (uint)bVar20 & 0xf)];
                  uVar45 = uVar45 & uVar45 - 1;
                  if ((uVar45 == 0) ||
                     (iVar29 = (int)lVar47, lVar47 = lVar26,
                     (int)(1L << (bVar19 & 0x3f)) + -1 == iVar29)) break;
                }
              }
              uVar45 = bVar20 - 1 & 0xf;
              *(char *)(pUVar13 + uVar37) = (char)uVar45;
              *(undefined1 *)((long)(pUVar13 + uVar37) + (ulong)uVar45 + 1) = auVar70[0];
              UVar32 = ms->nextToUpdate;
              ms->nextToUpdate = UVar32 + 1;
              pUVar12[uVar37 + uVar45] = UVar32;
              if (lVar26 == 0) {
                uVar40 = 3;
                uVar36 = 999999999;
              }
              else {
                uVar36 = 999999999;
                lVar47 = 0;
                uVar37 = 3;
                do {
                  uVar45 = auStack_b8[lVar47];
                  puVar43 = (ulong *)(pBVar28 + uVar45);
                  if (*(BYTE *)(uVar37 + (long)puVar43) == *(BYTE *)((long)puVar44 + uVar37)) {
                    puVar22 = puVar44;
                    if (puVar44 < puVar1) {
                      if (*puVar43 == *puVar44) {
                        lVar16 = (ulong)uVar45 + 8;
                        lVar34 = 0;
                        do {
                          puVar22 = (ulong *)(local_178 + lVar34);
                          if (puVar1 <= puVar22) {
                            puVar43 = (ulong *)(pBVar28 + lVar34 + lVar16);
                            goto LAB_006b2e9f;
                          }
                          lVar17 = lVar34 + lVar16;
                          lVar34 = lVar34 + 8;
                        } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                        uVar42 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                        uVar40 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                      }
                      else {
                        uVar42 = *puVar44 ^ *puVar43;
                        uVar40 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        uVar40 = uVar40 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_006b2e9f:
                      if ((puVar22 < puVar2) && ((int)*puVar43 == (int)*puVar22)) {
                        puVar22 = (ulong *)((long)puVar22 + 4);
                        puVar43 = (ulong *)((long)puVar43 + 4);
                      }
                      if ((puVar22 < puVar3) && ((short)*puVar43 == (short)*puVar22)) {
                        puVar22 = (ulong *)((long)puVar22 + 2);
                        puVar43 = (ulong *)((long)puVar43 + 2);
                      }
                      if (puVar22 < puVar5) {
                        puVar22 = (ulong *)((long)puVar22 +
                                           (ulong)((BYTE)*puVar43 == (BYTE)*puVar22));
                      }
                      uVar40 = (long)puVar22 - (long)puVar44;
                    }
                    if ((uVar37 < uVar40) &&
                       (uVar36 = (ulong)((uVar31 + 2) - uVar45), uVar37 = uVar40,
                       (ulong *)((long)puVar44 + uVar40) == puVar5)) break;
                  }
                  uVar40 = uVar37;
                  lVar47 = lVar47 + 1;
                  uVar37 = uVar40;
                } while (lVar47 != lVar26);
              }
            }
          }
          else if (uVar23 - 6 < 2) {
            pBVar28 = (ms->window).base;
            uVar37 = (long)puVar44 - (long)pBVar28;
            uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar32 = (ms->window).lowLimit;
            uVar45 = (uint)uVar37;
            UVar35 = uVar45 - uVar23;
            if (uVar45 - UVar32 <= uVar23) {
              UVar35 = UVar32;
            }
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            if (ms->loadedDictEnd != 0) {
              UVar35 = UVar32;
            }
            uVar36 = (ulong)ms->nextToUpdate;
            bVar19 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar45) {
              do {
                uVar33 = (uint)uVar36 & 7;
                uVar23 = ms->hashCache[uVar33];
                ms->hashCache[uVar33] =
                     (U32)((ulong)(*(long *)(pBVar28 + uVar36 + 8) * -0x30e4432340650000) >>
                          (bVar19 & 0x3f));
                uVar40 = (ulong)(uVar23 >> 3 & 0xffffffe0);
                uVar33 = (byte)((char)pUVar13[uVar40] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar40) = (char)uVar33;
                *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar40 * 2) = (char)uVar23;
                pUVar12[uVar40 + uVar33] = (uint)uVar36;
                uVar36 = uVar36 + 1;
              } while (uVar36 < (uVar37 & 0xffffffff));
            }
            ms->nextToUpdate = uVar45;
            uVar23 = ms->hashCache[uVar45 & 7];
            ms->hashCache[uVar45 & 7] =
                 (U32)((ulong)(*(long *)(pBVar28 + (uVar37 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar19 & 0x3f));
            uVar37 = (ulong)(uVar23 >> 3 & 0xffffffe0);
            bVar19 = (byte)pUVar13[uVar37];
            pcVar8 = (char *)((long)pUVar13 + uVar37 * 2 + 1);
            pcVar9 = (char *)((long)pUVar13 + uVar37 * 2 + 0x11);
            uVar76 = (undefined1)(uVar23 >> 0x18);
            uVar74 = (undefined1)(uVar23 >> 0x10);
            uVar72 = (undefined1)(uVar23 >> 8);
            auVar82._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                      0x20);
            auVar82[3] = uVar72;
            auVar82[2] = uVar72;
            auVar82[0] = (undefined1)uVar23;
            auVar82[1] = auVar82[0];
            auVar82._8_8_ = 0;
            auVar79 = pshuflw(auVar82,auVar82,0);
            cVar54 = auVar79[0];
            auVar51[0] = -(*pcVar8 == cVar54);
            cVar73 = auVar79[1];
            auVar51[1] = -(pcVar8[1] == cVar73);
            cVar75 = auVar79[2];
            auVar51[2] = -(pcVar8[2] == cVar75);
            cVar77 = auVar79[3];
            auVar51[3] = -(pcVar8[3] == cVar77);
            auVar51[4] = -(pcVar8[4] == cVar54);
            auVar51[5] = -(pcVar8[5] == cVar73);
            auVar51[6] = -(pcVar8[6] == cVar75);
            auVar51[7] = -(pcVar8[7] == cVar77);
            auVar51[8] = -(pcVar8[8] == cVar54);
            auVar51[9] = -(pcVar8[9] == cVar73);
            auVar51[10] = -(pcVar8[10] == cVar75);
            auVar51[0xb] = -(pcVar8[0xb] == cVar77);
            auVar51[0xc] = -(pcVar8[0xc] == cVar54);
            auVar51[0xd] = -(pcVar8[0xd] == cVar73);
            auVar51[0xe] = -(pcVar8[0xe] == cVar75);
            auVar51[0xf] = -(pcVar8[0xf] == cVar77);
            auVar63[0] = -(*pcVar9 == cVar54);
            auVar63[1] = -(pcVar9[1] == cVar73);
            auVar63[2] = -(pcVar9[2] == cVar75);
            auVar63[3] = -(pcVar9[3] == cVar77);
            auVar63[4] = -(pcVar9[4] == cVar54);
            auVar63[5] = -(pcVar9[5] == cVar73);
            auVar63[6] = -(pcVar9[6] == cVar75);
            auVar63[7] = -(pcVar9[7] == cVar77);
            auVar63[8] = -(pcVar9[8] == cVar54);
            auVar63[9] = -(pcVar9[9] == cVar73);
            auVar63[10] = -(pcVar9[10] == cVar75);
            auVar63[0xb] = -(pcVar9[0xb] == cVar77);
            auVar63[0xc] = -(pcVar9[0xc] == cVar54);
            auVar63[0xd] = -(pcVar9[0xd] == cVar73);
            auVar63[0xe] = -(pcVar9[0xe] == cVar75);
            auVar63[0xf] = -(pcVar9[0xf] == cVar77);
            uVar33 = CONCAT22((ushort)(SUB161(auVar63 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar63[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar51 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar51[0xf] >> 7) << 0xf);
            uVar23 = uVar33 >> (bVar19 & 0x1f) | uVar33 << 0x20 - (bVar19 & 0x1f);
            if ((bVar19 & 0x1f) == 0) {
              uVar23 = uVar33;
            }
            if (uVar23 == 0) {
              lVar26 = 0;
            }
            else {
              lVar47 = 0;
              while( true ) {
                iVar29 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                  }
                }
                lVar26 = lVar47;
                if (pUVar12[uVar37 + (iVar29 + (uint)bVar19 & 0x1f)] < UVar35) break;
                lVar26 = lVar47 + 1;
                auStack_b8[lVar47] = pUVar12[uVar37 + (iVar29 + (uint)bVar19 & 0x1f)];
                uVar23 = uVar23 & uVar23 - 1;
                if ((uVar23 == 0) || (iVar29 = (int)lVar47, lVar47 = lVar26, iVar29 == 0x1f)) break;
              }
            }
            uVar23 = bVar19 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar37) = (char)uVar23;
            *(undefined1 *)((long)(pUVar13 + uVar37) + (ulong)uVar23 + 1) = auVar82[0];
            UVar32 = ms->nextToUpdate;
            ms->nextToUpdate = UVar32 + 1;
            pUVar12[uVar37 + uVar23] = UVar32;
            if (lVar26 == 0) {
              uVar40 = 3;
              uVar36 = 999999999;
            }
            else {
              uVar36 = 999999999;
              lVar47 = 0;
              uVar37 = 3;
              do {
                uVar23 = auStack_b8[lVar47];
                puVar43 = (ulong *)(pBVar28 + uVar23);
                if (*(BYTE *)(uVar37 + (long)puVar43) == *(BYTE *)((long)puVar44 + uVar37)) {
                  puVar22 = puVar44;
                  if (puVar44 < puVar1) {
                    if (*puVar43 == *puVar44) {
                      lVar16 = (ulong)uVar23 + 8;
                      lVar34 = 0;
                      do {
                        puVar22 = (ulong *)(local_178 + lVar34);
                        if (puVar1 <= puVar22) {
                          puVar43 = (ulong *)(pBVar28 + lVar34 + lVar16);
                          goto LAB_006b26f1;
                        }
                        lVar17 = lVar34 + lVar16;
                        lVar34 = lVar34 + 8;
                      } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                      uVar42 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                      uVar40 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                    }
                    else {
                      uVar42 = *puVar44 ^ *puVar43;
                      uVar40 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = uVar40 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_006b26f1:
                    if ((puVar22 < puVar2) && ((int)*puVar43 == (int)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 4);
                      puVar43 = (ulong *)((long)puVar43 + 4);
                    }
                    if ((puVar22 < puVar3) && ((short)*puVar43 == (short)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 2);
                      puVar43 = (ulong *)((long)puVar43 + 2);
                    }
                    if (puVar22 < puVar5) {
                      puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar22))
                      ;
                    }
                    uVar40 = (long)puVar22 - (long)puVar44;
                  }
                  if ((uVar37 < uVar40) &&
                     (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar37 = uVar40,
                     (ulong *)((long)puVar44 + uVar40) == puVar5)) break;
                }
                uVar40 = uVar37;
                lVar47 = lVar47 + 1;
                uVar37 = uVar40;
              } while (lVar47 != lVar26);
            }
          }
          else if (uVar23 == 5) {
            pBVar28 = (ms->window).base;
            uVar37 = (long)puVar44 - (long)pBVar28;
            uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar32 = (ms->window).lowLimit;
            uVar45 = (uint)uVar37;
            UVar35 = uVar45 - uVar23;
            if (uVar45 - UVar32 <= uVar23) {
              UVar35 = UVar32;
            }
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            if (ms->loadedDictEnd != 0) {
              UVar35 = UVar32;
            }
            uVar36 = (ulong)ms->nextToUpdate;
            bVar19 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar45) {
              do {
                uVar33 = (uint)uVar36 & 7;
                uVar23 = ms->hashCache[uVar33];
                ms->hashCache[uVar33] =
                     (U32)((ulong)(*(long *)(pBVar28 + uVar36 + 8) * -0x30e4432345000000) >>
                          (bVar19 & 0x3f));
                uVar40 = (ulong)(uVar23 >> 3 & 0xffffffe0);
                uVar33 = (byte)((char)pUVar13[uVar40] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar40) = (char)uVar33;
                *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar40 * 2) = (char)uVar23;
                pUVar12[uVar40 + uVar33] = (uint)uVar36;
                uVar36 = uVar36 + 1;
              } while (uVar36 < (uVar37 & 0xffffffff));
            }
            ms->nextToUpdate = uVar45;
            uVar23 = ms->hashCache[uVar45 & 7];
            ms->hashCache[uVar45 & 7] =
                 (U32)((ulong)(*(long *)(pBVar28 + (uVar37 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar19 & 0x3f));
            uVar37 = (ulong)(uVar23 >> 3 & 0xffffffe0);
            bVar19 = (byte)pUVar13[uVar37];
            pcVar8 = (char *)((long)pUVar13 + uVar37 * 2 + 1);
            pcVar9 = (char *)((long)pUVar13 + uVar37 * 2 + 0x11);
            uVar76 = (undefined1)(uVar23 >> 0x18);
            uVar74 = (undefined1)(uVar23 >> 0x10);
            uVar72 = (undefined1)(uVar23 >> 8);
            auVar83._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                      0x20);
            auVar83[3] = uVar72;
            auVar83[2] = uVar72;
            auVar83[0] = (undefined1)uVar23;
            auVar83[1] = auVar83[0];
            auVar83._8_8_ = 0;
            auVar79 = pshuflw(auVar83,auVar83,0);
            cVar54 = auVar79[0];
            auVar52[0] = -(*pcVar8 == cVar54);
            cVar73 = auVar79[1];
            auVar52[1] = -(pcVar8[1] == cVar73);
            cVar75 = auVar79[2];
            auVar52[2] = -(pcVar8[2] == cVar75);
            cVar77 = auVar79[3];
            auVar52[3] = -(pcVar8[3] == cVar77);
            auVar52[4] = -(pcVar8[4] == cVar54);
            auVar52[5] = -(pcVar8[5] == cVar73);
            auVar52[6] = -(pcVar8[6] == cVar75);
            auVar52[7] = -(pcVar8[7] == cVar77);
            auVar52[8] = -(pcVar8[8] == cVar54);
            auVar52[9] = -(pcVar8[9] == cVar73);
            auVar52[10] = -(pcVar8[10] == cVar75);
            auVar52[0xb] = -(pcVar8[0xb] == cVar77);
            auVar52[0xc] = -(pcVar8[0xc] == cVar54);
            auVar52[0xd] = -(pcVar8[0xd] == cVar73);
            auVar52[0xe] = -(pcVar8[0xe] == cVar75);
            auVar52[0xf] = -(pcVar8[0xf] == cVar77);
            auVar66[0] = -(*pcVar9 == cVar54);
            auVar66[1] = -(pcVar9[1] == cVar73);
            auVar66[2] = -(pcVar9[2] == cVar75);
            auVar66[3] = -(pcVar9[3] == cVar77);
            auVar66[4] = -(pcVar9[4] == cVar54);
            auVar66[5] = -(pcVar9[5] == cVar73);
            auVar66[6] = -(pcVar9[6] == cVar75);
            auVar66[7] = -(pcVar9[7] == cVar77);
            auVar66[8] = -(pcVar9[8] == cVar54);
            auVar66[9] = -(pcVar9[9] == cVar73);
            auVar66[10] = -(pcVar9[10] == cVar75);
            auVar66[0xb] = -(pcVar9[0xb] == cVar77);
            auVar66[0xc] = -(pcVar9[0xc] == cVar54);
            auVar66[0xd] = -(pcVar9[0xd] == cVar73);
            auVar66[0xe] = -(pcVar9[0xe] == cVar75);
            auVar66[0xf] = -(pcVar9[0xf] == cVar77);
            uVar33 = CONCAT22((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar66[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar52[0xf] >> 7) << 0xf);
            uVar23 = uVar33 >> (bVar19 & 0x1f) | uVar33 << 0x20 - (bVar19 & 0x1f);
            if ((bVar19 & 0x1f) == 0) {
              uVar23 = uVar33;
            }
            if (uVar23 == 0) {
              lVar26 = 0;
            }
            else {
              lVar47 = 0;
              while( true ) {
                iVar29 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                  }
                }
                lVar26 = lVar47;
                if (pUVar12[uVar37 + (iVar29 + (uint)bVar19 & 0x1f)] < UVar35) break;
                lVar26 = lVar47 + 1;
                auStack_b8[lVar47] = pUVar12[uVar37 + (iVar29 + (uint)bVar19 & 0x1f)];
                uVar23 = uVar23 & uVar23 - 1;
                if ((uVar23 == 0) || (iVar29 = (int)lVar47, lVar47 = lVar26, iVar29 == 0x1f)) break;
              }
            }
            uVar23 = bVar19 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar37) = (char)uVar23;
            *(undefined1 *)((long)(pUVar13 + uVar37) + (ulong)uVar23 + 1) = auVar83[0];
            UVar32 = ms->nextToUpdate;
            ms->nextToUpdate = UVar32 + 1;
            pUVar12[uVar37 + uVar23] = UVar32;
            if (lVar26 == 0) {
LAB_006b2d45:
              uVar40 = 3;
              uVar36 = 999999999;
            }
            else {
              uVar36 = 999999999;
              lVar47 = 0;
              uVar37 = 3;
              do {
                uVar23 = auStack_b8[lVar47];
                puVar43 = (ulong *)(pBVar28 + uVar23);
                if (*(BYTE *)(uVar37 + (long)puVar43) == *(BYTE *)((long)puVar44 + uVar37)) {
                  puVar22 = puVar44;
                  if (puVar44 < puVar1) {
                    if (*puVar43 == *puVar44) {
                      lVar16 = (ulong)uVar23 + 8;
                      lVar34 = 0;
                      do {
                        puVar22 = (ulong *)(local_178 + lVar34);
                        if (puVar1 <= puVar22) {
                          puVar43 = (ulong *)(pBVar28 + lVar34 + lVar16);
                          goto LAB_006b29f5;
                        }
                        lVar17 = lVar34 + lVar16;
                        lVar34 = lVar34 + 8;
                      } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                      uVar42 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                      uVar40 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                    }
                    else {
                      uVar42 = *puVar44 ^ *puVar43;
                      uVar40 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar40 = uVar40 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_006b29f5:
                    if ((puVar22 < puVar2) && ((int)*puVar43 == (int)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 4);
                      puVar43 = (ulong *)((long)puVar43 + 4);
                    }
                    if ((puVar22 < puVar3) && ((short)*puVar43 == (short)*puVar22)) {
                      puVar22 = (ulong *)((long)puVar22 + 2);
                      puVar43 = (ulong *)((long)puVar43 + 2);
                    }
                    if (puVar22 < puVar5) {
                      puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar22))
                      ;
                    }
                    uVar40 = (long)puVar22 - (long)puVar44;
                  }
                  if ((uVar37 < uVar40) &&
                     (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar37 = uVar40,
                     (ulong *)((long)puVar44 + uVar40) == puVar5)) break;
                }
                uVar40 = uVar37;
                lVar47 = lVar47 + 1;
                uVar37 = uVar40;
              } while (lVar47 != lVar26);
            }
          }
          else {
            pBVar28 = (ms->window).base;
            uVar37 = (long)puVar44 - (long)pBVar28;
            uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar32 = (ms->window).lowLimit;
            uVar45 = (uint)uVar37;
            UVar35 = uVar45 - uVar23;
            if (uVar45 - UVar32 <= uVar23) {
              UVar35 = UVar32;
            }
            pUVar12 = ms->hashTable;
            pUVar13 = ms->tagTable;
            if (ms->loadedDictEnd != 0) {
              UVar35 = UVar32;
            }
            uVar36 = (ulong)ms->nextToUpdate;
            bVar19 = 0x18 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar45) {
              do {
                uVar33 = (uint)uVar36 & 7;
                uVar23 = ms->hashCache[uVar33];
                ms->hashCache[uVar33] =
                     (uint)(*(int *)(pBVar28 + uVar36 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
                uVar40 = (ulong)(uVar23 >> 3 & 0xffffffe0);
                uVar33 = (byte)((char)pUVar13[uVar40] - 1) & 0x1f;
                *(char *)(pUVar13 + uVar40) = (char)uVar33;
                *(char *)((long)pUVar13 + (ulong)uVar33 + 1 + uVar40 * 2) = (char)uVar23;
                pUVar12[uVar40 + uVar33] = (uint)uVar36;
                uVar36 = uVar36 + 1;
              } while (uVar36 < (uVar37 & 0xffffffff));
            }
            ms->nextToUpdate = uVar45;
            uVar23 = ms->hashCache[uVar45 & 7];
            ms->hashCache[uVar45 & 7] =
                 (uint)(*(int *)(pBVar28 + (uVar37 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar19 & 0x1f);
            uVar37 = (ulong)(uVar23 >> 3 & 0xffffffe0);
            bVar19 = (byte)pUVar13[uVar37];
            pcVar8 = (char *)((long)pUVar13 + uVar37 * 2 + 1);
            pcVar9 = (char *)((long)pUVar13 + uVar37 * 2 + 0x11);
            uVar76 = (undefined1)(uVar23 >> 0x18);
            uVar74 = (undefined1)(uVar23 >> 0x10);
            uVar72 = (undefined1)(uVar23 >> 8);
            auVar84._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar76,uVar76),uVar74),CONCAT14(uVar74,uVar23)) >>
                      0x20);
            auVar84[3] = uVar72;
            auVar84[2] = uVar72;
            auVar84[0] = (undefined1)uVar23;
            auVar84[1] = auVar84[0];
            auVar84._8_8_ = 0;
            auVar79 = pshuflw(auVar84,auVar84,0);
            cVar54 = auVar79[0];
            auVar53[0] = -(*pcVar8 == cVar54);
            cVar73 = auVar79[1];
            auVar53[1] = -(pcVar8[1] == cVar73);
            cVar75 = auVar79[2];
            auVar53[2] = -(pcVar8[2] == cVar75);
            cVar77 = auVar79[3];
            auVar53[3] = -(pcVar8[3] == cVar77);
            auVar53[4] = -(pcVar8[4] == cVar54);
            auVar53[5] = -(pcVar8[5] == cVar73);
            auVar53[6] = -(pcVar8[6] == cVar75);
            auVar53[7] = -(pcVar8[7] == cVar77);
            auVar53[8] = -(pcVar8[8] == cVar54);
            auVar53[9] = -(pcVar8[9] == cVar73);
            auVar53[10] = -(pcVar8[10] == cVar75);
            auVar53[0xb] = -(pcVar8[0xb] == cVar77);
            auVar53[0xc] = -(pcVar8[0xc] == cVar54);
            auVar53[0xd] = -(pcVar8[0xd] == cVar73);
            auVar53[0xe] = -(pcVar8[0xe] == cVar75);
            auVar53[0xf] = -(pcVar8[0xf] == cVar77);
            auVar69[0] = -(*pcVar9 == cVar54);
            auVar69[1] = -(pcVar9[1] == cVar73);
            auVar69[2] = -(pcVar9[2] == cVar75);
            auVar69[3] = -(pcVar9[3] == cVar77);
            auVar69[4] = -(pcVar9[4] == cVar54);
            auVar69[5] = -(pcVar9[5] == cVar73);
            auVar69[6] = -(pcVar9[6] == cVar75);
            auVar69[7] = -(pcVar9[7] == cVar77);
            auVar69[8] = -(pcVar9[8] == cVar54);
            auVar69[9] = -(pcVar9[9] == cVar73);
            auVar69[10] = -(pcVar9[10] == cVar75);
            auVar69[0xb] = -(pcVar9[0xb] == cVar77);
            auVar69[0xc] = -(pcVar9[0xc] == cVar54);
            auVar69[0xd] = -(pcVar9[0xd] == cVar73);
            auVar69[0xe] = -(pcVar9[0xe] == cVar75);
            auVar69[0xf] = -(pcVar9[0xf] == cVar77);
            uVar33 = CONCAT22((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar69[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar53[0xf] >> 7) << 0xf);
            uVar23 = uVar33 >> (bVar19 & 0x1f) | uVar33 << 0x20 - (bVar19 & 0x1f);
            if ((bVar19 & 0x1f) == 0) {
              uVar23 = uVar33;
            }
            if (uVar23 == 0) {
              lVar26 = 0;
            }
            else {
              lVar47 = 0;
              while( true ) {
                iVar29 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                  }
                }
                lVar26 = lVar47;
                if (pUVar12[uVar37 + (iVar29 + (uint)bVar19 & 0x1f)] < UVar35) break;
                lVar26 = lVar47 + 1;
                auStack_b8[lVar47] = pUVar12[uVar37 + (iVar29 + (uint)bVar19 & 0x1f)];
                uVar23 = uVar23 & uVar23 - 1;
                if ((uVar23 == 0) || (iVar29 = (int)lVar47, lVar47 = lVar26, iVar29 == 0x1f)) break;
              }
            }
            uVar23 = bVar19 - 1 & 0x1f;
            *(char *)(pUVar13 + uVar37) = (char)uVar23;
            *(undefined1 *)((long)(pUVar13 + uVar37) + (ulong)uVar23 + 1) = auVar84[0];
            UVar32 = ms->nextToUpdate;
            ms->nextToUpdate = UVar32 + 1;
            pUVar12[uVar37 + uVar23] = UVar32;
            if (lVar26 == 0) goto LAB_006b2d45;
            uVar36 = 999999999;
            lVar47 = 0;
            uVar37 = 3;
            do {
              uVar23 = auStack_b8[lVar47];
              puVar43 = (ulong *)(pBVar28 + uVar23);
              if (*(BYTE *)(uVar37 + (long)puVar43) == *(BYTE *)((long)puVar44 + uVar37)) {
                puVar22 = puVar44;
                if (puVar44 < puVar1) {
                  if (*puVar43 == *puVar44) {
                    lVar16 = (ulong)uVar23 + 8;
                    lVar34 = 0;
                    do {
                      puVar22 = (ulong *)(local_178 + lVar34);
                      if (puVar1 <= puVar22) {
                        puVar43 = (ulong *)(pBVar28 + lVar34 + lVar16);
                        goto LAB_006b2cd0;
                      }
                      lVar17 = lVar34 + lVar16;
                      lVar34 = lVar34 + 8;
                    } while (*(ulong *)(pBVar28 + lVar17) == *puVar22);
                    uVar42 = *puVar22 ^ *(ulong *)(pBVar28 + lVar17);
                    uVar40 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                  }
                  else {
                    uVar42 = *puVar44 ^ *puVar43;
                    uVar40 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = uVar40 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_006b2cd0:
                  if ((puVar22 < puVar2) && ((int)*puVar43 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar43 = (ulong *)((long)puVar43 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar43 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar43 = (ulong *)((long)puVar43 + 2);
                  }
                  if (puVar22 < puVar5) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar22));
                  }
                  uVar40 = (long)puVar22 - (long)puVar44;
                }
                if ((uVar37 < uVar40) &&
                   (uVar36 = (ulong)((uVar45 + 2) - uVar23), uVar37 = uVar40,
                   (ulong *)((long)puVar44 + uVar40) == puVar5)) break;
              }
              uVar40 = uVar37;
              lVar47 = lVar47 + 1;
              uVar37 = uVar40;
            } while (lVar47 != lVar26);
          }
          if (uVar40 < 4) break;
          uVar23 = (int)local_140 + 1;
          uVar45 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar45 == 0; uVar45 = uVar45 - 1) {
            }
          }
          uVar23 = (int)uVar36 + 1;
          iVar29 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> iVar29 == 0; iVar29 = iVar29 + -1) {
            }
          }
          local_110 = (ulong *)((long)local_110 + 1);
          local_178 = local_178 + 1;
          puVar43 = puVar44;
        } while ((int)((uVar45 ^ 0x1f) + (int)uVar25 * 4 + -0x1b) < (int)uVar40 * 4 - iVar29);
        if (local_140 == 0) {
          UVar32 = 1;
          uVar45 = uVar24;
        }
        else {
          if ((src < local_f8) && (pBVar39 < (BYTE *)((long)local_f8 + (2 - local_140)))) {
            puVar43 = local_f8;
            while (local_f8 = puVar43,
                  *(BYTE *)((long)puVar43 - 1) == *(BYTE *)((long)puVar43 + (1 - local_140))) {
              local_f8 = (ulong *)((long)puVar43 - 1);
              uVar25 = uVar25 + 1;
              if ((local_f8 <= src) ||
                 (pBVar28 = (BYTE *)((long)puVar43 + (1 - local_140)), puVar43 = local_f8,
                 pBVar28 <= pBVar39)) break;
            }
          }
          UVar32 = (int)local_140 + 1;
          uVar45 = (int)local_140 - 2;
          local_128 = uVar24;
        }
        uVar37 = (ulong)uVar45;
        uVar36 = (long)local_f8 - (long)src;
        puVar43 = (ulong *)seqStore->lit;
        if (puVar4 < local_f8) {
          puVar44 = puVar43;
          puVar22 = (ulong *)src;
          if (src <= puVar4) {
            puVar44 = (ulong *)((long)puVar43 + ((long)puVar4 - (long)src));
            uVar40 = *(ulong *)((long)src + 8);
            *puVar43 = *src;
            puVar43[1] = uVar40;
            puVar22 = puVar4;
            if (0x10 < (long)puVar4 - (long)src) {
              lVar46 = 0x10;
              do {
                uVar15 = *(undefined8 *)((BYTE *)((long)src + lVar46) + 8);
                puVar6 = (undefined8 *)((long)puVar43 + lVar46);
                *puVar6 = *(undefined8 *)((long)src + lVar46);
                puVar6[1] = uVar15;
                pBVar28 = (BYTE *)((long)src + lVar46 + 0x10);
                uVar15 = *(undefined8 *)(pBVar28 + 8);
                puVar6[2] = *(undefined8 *)pBVar28;
                puVar6[3] = uVar15;
                lVar46 = lVar46 + 0x20;
              } while (puVar6 + 4 < puVar44);
            }
          }
          if (puVar22 < local_f8) {
            lVar46 = 0;
            do {
              *(BYTE *)((long)puVar44 + lVar46) = *(BYTE *)((long)puVar22 + lVar46);
              lVar46 = lVar46 + 1;
            } while ((long)local_f8 - (long)puVar22 != lVar46);
          }
LAB_006b309a:
          seqStore->lit = seqStore->lit + uVar36;
          psVar18 = seqStore->sequences;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar40 = *(ulong *)((long)src + 8);
          *puVar43 = *src;
          puVar43[1] = uVar40;
          pBVar28 = seqStore->lit;
          if (0x10 < uVar36) {
            uVar40 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar28 + 0x18) = uVar40;
            if (0x20 < (long)uVar36) {
              lVar46 = 0;
              do {
                pBVar10 = (BYTE *)((long)src + lVar46 + 0x20);
                uVar15 = *(undefined8 *)(pBVar10 + 8);
                pBVar7 = pBVar28 + lVar46 + 0x20;
                *(undefined8 *)pBVar7 = *(undefined8 *)pBVar10;
                *(undefined8 *)(pBVar7 + 8) = uVar15;
                pBVar10 = (BYTE *)((long)src + lVar46 + 0x30);
                uVar15 = *(undefined8 *)(pBVar10 + 8);
                *(undefined8 *)(pBVar7 + 0x10) = *(undefined8 *)pBVar10;
                *(undefined8 *)(pBVar7 + 0x18) = uVar15;
                lVar46 = lVar46 + 0x20;
              } while (pBVar7 + 0x20 < pBVar28 + uVar36);
            }
            goto LAB_006b309a;
          }
          seqStore->lit = pBVar28 + uVar36;
          psVar18 = seqStore->sequences;
        }
        psVar18->litLength = (U16)uVar36;
        psVar18->offset = UVar32;
        if (0xffff < uVar25 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(uVar25 - 3);
        psVar18 = psVar18 + 1;
        seqStore->sequences = psVar18;
        puVar43 = (ulong *)((long)local_f8 + uVar25);
        src = puVar43;
        if ((local_128 != 0) && (puVar43 <= iLimit)) {
          while( true ) {
            uVar25 = (ulong)local_128;
            uVar24 = (uint)uVar37;
            src = puVar43;
            if ((int)*puVar43 != *(int *)((long)puVar43 - uVar25)) break;
            lVar46 = -uVar25;
            puVar44 = (ulong *)((long)puVar43 + 4);
            puVar21 = (ulong *)((long)puVar43 + lVar46 + 4);
            puVar22 = puVar44;
            if (puVar44 < puVar1) {
              if (*puVar21 == *puVar44) {
                lVar26 = 0;
                do {
                  puVar22 = (ulong *)((long)puVar43 + lVar26 + 0xc);
                  if (puVar1 <= puVar22) {
                    puVar21 = (ulong *)((long)puVar43 + lVar46 + lVar26 + 0xc);
                    puVar22 = (ulong *)((long)puVar43 + lVar26 + 0xc);
                    goto LAB_006b31e5;
                  }
                  uVar37 = *(ulong *)((long)puVar43 + lVar26 + lVar46 + 0xc);
                  uVar36 = *puVar22;
                  lVar26 = lVar26 + 8;
                } while (uVar37 == uVar36);
                uVar36 = uVar36 ^ uVar37;
                uVar37 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar26;
              }
              else {
                uVar36 = *puVar44 ^ *puVar21;
                uVar37 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                uVar37 = uVar37 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006b31e5:
              if ((puVar22 < puVar2) && ((int)*puVar21 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar21 = (ulong *)((long)puVar21 + 4);
              }
              if ((puVar22 < puVar3) && ((short)*puVar21 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar21 = (ulong *)((long)puVar21 + 2);
              }
              if (puVar22 < puVar5) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar22));
              }
              uVar37 = (long)puVar22 - (long)puVar44;
            }
            if (puVar43 <= puVar4) {
              puVar44 = (ulong *)seqStore->lit;
              uVar36 = puVar43[1];
              *puVar44 = *puVar43;
              puVar44[1] = uVar36;
              psVar18 = seqStore->sequences;
            }
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < uVar37 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(uVar37 + 1);
            psVar18 = psVar18 + 1;
            seqStore->sequences = psVar18;
            puVar43 = (ulong *)((long)puVar43 + uVar37 + 4);
            uVar37 = uVar25;
            src = puVar43;
            local_128 = uVar24;
            if ((uVar24 == 0) || (iLimit < puVar43)) break;
          }
        }
      }
      uVar24 = (uint)uVar37;
    } while (puVar43 < iLimit);
  }
  uVar45 = 0;
  if (uVar30 < uVar38) {
    uVar45 = uVar38;
  }
  if (uVar30 < uVar11) {
    uVar45 = uVar11;
  }
  if (uVar24 == 0) {
    uVar24 = uVar45;
  }
  if (local_128 != 0) {
    uVar45 = local_128;
  }
  *rep = uVar24;
  rep[1] = uVar45;
  return (long)puVar5 - (long)src;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
ZSTD_compressBlock_lazy_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const searchMethod_e searchMethod, const U32 depth,
                        ZSTD_dictMode_e const dictMode)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = searchMethod == search_rowHash ? iend - 8 - ZSTD_ROW_HASH_CACHE_SIZE : iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 prefixLowestIndex = ms->window.dictLimit;
    const BYTE* const prefixLowest = base + prefixLowestIndex;
    const U32 rowLog = ms->cParams.searchLog < 5 ? 4 : 5;

    typedef size_t (*searchMax_f)(
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* iLimit, size_t* offsetPtr);

    /**
     * This table is indexed first by the four ZSTD_dictMode_e values, and then
     * by the two searchMethod_e values. NULLs are placed for configurations
     * that should never occur (extDict modes go to the other implementation
     * below and there is no DDSS for binary tree search yet).
     */
    const searchMax_f searchFuncs[4][3] = {
        {
            ZSTD_HcFindBestMatch_selectMLS,
            ZSTD_BtFindBestMatch_selectMLS,
            ZSTD_RowFindBestMatch_selectRowLog
        },
        {
            NULL,
            NULL,
            NULL
        },
        {
            ZSTD_HcFindBestMatch_dictMatchState_selectMLS,
            ZSTD_BtFindBestMatch_dictMatchState_selectMLS,
            ZSTD_RowFindBestMatch_dictMatchState_selectRowLog
        },
        {
            ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS,
            NULL,
            ZSTD_RowFindBestMatch_dedicatedDictSearch_selectRowLog
        }
    };

    searchMax_f const searchMax = searchFuncs[dictMode][(int)searchMethod];
    U32 offset_1 = rep[0], offset_2 = rep[1], savedOffset=0;

    const int isDMS = dictMode == ZSTD_dictMatchState;
    const int isDDS = dictMode == ZSTD_dedicatedDictSearch;
    const int isDxS = isDMS || isDDS;
    const ZSTD_matchState_t* const dms = ms->dictMatchState;
    const U32 dictLowestIndex      = isDxS ? dms->window.dictLimit : 0;
    const BYTE* const dictBase     = isDxS ? dms->window.base : NULL;
    const BYTE* const dictLowest   = isDxS ? dictBase + dictLowestIndex : NULL;
    const BYTE* const dictEnd      = isDxS ? dms->window.nextSrc : NULL;
    const U32 dictIndexDelta       = isDxS ?
                                     prefixLowestIndex - (U32)(dictEnd - dictBase) :
                                     0;
    const U32 dictAndPrefixLength = (U32)((ip - prefixLowest) + (dictEnd - dictLowest));

    assert(searchMax != NULL);

    DEBUGLOG(5, "ZSTD_compressBlock_lazy_generic (dictMode=%u) (searchFunc=%u)", (U32)dictMode, (U32)searchMethod);
    ip += (dictAndPrefixLength == 0);
    if (dictMode == ZSTD_noDict) {
        U32 const curr = (U32)(ip - base);
        U32 const windowLow = ZSTD_getLowestPrefixIndex(ms, curr, ms->cParams.windowLog);
        U32 const maxRep = curr - windowLow;
        if (offset_2 > maxRep) savedOffset = offset_2, offset_2 = 0;
        if (offset_1 > maxRep) savedOffset = offset_1, offset_1 = 0;
    }
    if (isDxS) {
        /* dictMatchState repCode checks don't currently handle repCode == 0
         * disabling. */
        assert(offset_1 <= dictAndPrefixLength);
        assert(offset_2 <= dictAndPrefixLength);
    }

    if (searchMethod == search_rowHash) {
        ZSTD_row_fillHashCache(ms, base, rowLog,
                            MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */),
                            ms->nextToUpdate, ilimit);
    }

    /* Match Loop */
#if defined(__GNUC__) && defined(__x86_64__)
    /* I've measured random a 5% speed loss on levels 5 & 6 (greedy) when the
     * code alignment is perturbed. To fix the instability align the loop on 32-bytes.
     */
    __asm__(".p2align 5");
#endif
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offset=0;
        const BYTE* start=ip+1;

        /* check repCode */
        if (isDxS) {
            const U32 repIndex = (U32)(ip - base) + 1 - offset_1;
            const BYTE* repMatch = ((dictMode == ZSTD_dictMatchState || dictMode == ZSTD_dedicatedDictSearch)
                                && repIndex < prefixLowestIndex) ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
            if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
                const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                if (depth==0) goto _storeSequence;
            }
        }
        if ( dictMode == ZSTD_noDict
          && ((offset_1 > 0) & (MEM_read32(ip+1-offset_1) == MEM_read32(ip+1)))) {
            matchLength = ZSTD_count(ip+1+4, ip+1+4-offset_1, iend) + 4;
            if (depth==0) goto _storeSequence;
        }

        /* first search (depth 0) */
        {   size_t offsetFound = 999999999;
            size_t const ml2 = searchMax(ms, ip, iend, &offsetFound);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offset=offsetFound;
        }

        if (matchLength < 4) {
            ip += ((ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            ip ++;
            if ( (dictMode == ZSTD_noDict)
              && (offset) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                int const gain2 = (int)(mlRep * 3);
                int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                if ((mlRep >= 4) && (gain2 > gain1))
                    matchLength = mlRep, offset = 0, start = ip;
            }
            if (isDxS) {
                const U32 repIndex = (U32)(ip - base) - offset_1;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                               dictBase + (repIndex - dictIndexDelta) :
                               base + repIndex;
                if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                    && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                    size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                    int const gain2 = (int)(mlRep * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offset = 0, start = ip;
                }
            }
            {   size_t offset2=999999999;
                size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offset = offset2, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                ip ++;
                if ( (dictMode == ZSTD_noDict)
                  && (offset) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                    size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                    int const gain2 = (int)(mlRep * 4);
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offset = 0, start = ip;
                }
                if (isDxS) {
                    const U32 repIndex = (U32)(ip - base) - offset_1;
                    const BYTE* repMatch = repIndex < prefixLowestIndex ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
                    if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                        && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                        const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                        size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                        int const gain2 = (int)(mlRep * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                        if ((mlRep >= 4) && (gain2 > gain1))
                            matchLength = mlRep, offset = 0, start = ip;
                    }
                }
                {   size_t offset2=999999999;
                    size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offset = offset2, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* NOTE:
         * start[-offset+ZSTD_REP_MOVE-1] is undefined behavior.
         * (-offset+ZSTD_REP_MOVE-1) is unsigned, and is added to start, which
         * overflows the pointer, which is undefined behavior.
         */
        /* catch up */
        if (offset) {
            if (dictMode == ZSTD_noDict) {
                while ( ((start > anchor) & (start - (offset-ZSTD_REP_MOVE) > prefixLowest))
                     && (start[-1] == (start-(offset-ZSTD_REP_MOVE))[-1]) )  /* only search for offset within prefix */
                    { start--; matchLength++; }
            }
            if (isDxS) {
                U32 const matchIndex = (U32)((start-base) - (offset - ZSTD_REP_MOVE));
                const BYTE* match = (matchIndex < prefixLowestIndex) ? dictBase + matchIndex - dictIndexDelta : base + matchIndex;
                const BYTE* const mStart = (matchIndex < prefixLowestIndex) ? dictLowest : prefixLowest;
                while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            }
            offset_2 = offset_1; offset_1 = (U32)(offset - ZSTD_REP_MOVE);
        }
        /* store sequence */
_storeSequence:
        {   size_t const litLength = start - anchor;
            ZSTD_storeSeq(seqStore, litLength, anchor, iend, (U32)offset, matchLength-MINMATCH);
            anchor = ip = start + matchLength;
        }

        /* check immediate repcode */
        if (isDxS) {
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex = current2 - offset_2;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                        dictBase - dictIndexDelta + repIndex :
                        base + repIndex;
                if ( ((U32)((prefixLowestIndex-1) - (U32)repIndex) >= 3 /* intentional overflow */)
                   && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex < prefixLowestIndex ? dictEnd : iend;
                    matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd2, prefixLowest) + 4;
                    offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, matchLength-MINMATCH);
                    ip += matchLength;
                    anchor = ip;
                    continue;
                }
                break;
            }
        }

        if (dictMode == ZSTD_noDict) {
            while ( ((ip <= ilimit) & (offset_2>0))
                 && (MEM_read32(ip) == MEM_read32(ip - offset_2)) ) {
                /* store sequence */
                matchLength = ZSTD_count(ip+4, ip+4-offset_2, iend) + 4;
                offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset; /* swap repcodes */
                ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, matchLength-MINMATCH);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
    }   }   }

    /* Save reps for next block */
    rep[0] = offset_1 ? offset_1 : savedOffset;
    rep[1] = offset_2 ? offset_2 : savedOffset;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}